

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  long lVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  ulong uVar67;
  bool bVar68;
  bool bVar69;
  float fVar70;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar71;
  undefined1 auVar80 [16];
  undefined1 auVar84 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar103;
  vint4 bi_1;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar102;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 extraout_var [56];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar133;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar148;
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar149;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar150;
  float fVar166;
  float fVar167;
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar168;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar169;
  float fVar170;
  float fVar171;
  undefined8 uVar172;
  float fVar192;
  vfloat4 b0_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar190;
  float fVar194;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar191;
  float fVar193;
  float fVar195;
  undefined1 auVar189 [32];
  float fVar199;
  float fVar213;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar214;
  float fVar233;
  vint4 ai_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  float fVar234;
  float fVar246;
  vfloat4 a0_2;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar255;
  float fVar256;
  vfloat4 a0_3;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar257;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  float fVar269;
  float fVar282;
  float fVar283;
  vfloat4 a0_1;
  undefined1 auVar270 [16];
  float fVar284;
  undefined1 auVar271 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar272 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  vfloat4 a0;
  undefined1 auVar285 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar286 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar310 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar311 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_771;
  undefined1 local_770 [16];
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined4 local_5b0;
  undefined4 local_5a0;
  uint auStack_520 [4];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar62;
  undefined1 auVar130 [32];
  
  PVar3 = prim[1];
  uVar67 = (ulong)(byte)PVar3;
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar70 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar72._0_4_ = fVar70 * auVar8._0_4_;
  auVar72._4_4_ = fVar70 * auVar8._4_4_;
  auVar72._8_4_ = fVar70 * auVar8._8_4_;
  auVar72._12_4_ = fVar70 * auVar8._12_4_;
  auVar151._0_4_ = fVar70 * auVar9._0_4_;
  auVar151._4_4_ = fVar70 * auVar9._4_4_;
  auVar151._8_4_ = fVar70 * auVar9._8_4_;
  auVar151._12_4_ = fVar70 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar300 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar300 = vcvtdq2ps_avx(auVar300);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar67 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar61 = (ulong)(uint)((int)(uVar67 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + uVar67 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar61 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar295._4_4_ = auVar151._0_4_;
  auVar295._0_4_ = auVar151._0_4_;
  auVar295._8_4_ = auVar151._0_4_;
  auVar295._12_4_ = auVar151._0_4_;
  auVar87 = vshufps_avx(auVar151,auVar151,0x55);
  auVar73 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar70 = auVar73._0_4_;
  auVar261._0_4_ = fVar70 * auVar300._0_4_;
  fVar85 = auVar73._4_4_;
  auVar261._4_4_ = fVar85 * auVar300._4_4_;
  fVar150 = auVar73._8_4_;
  auVar261._8_4_ = fVar150 * auVar300._8_4_;
  fVar166 = auVar73._12_4_;
  auVar261._12_4_ = fVar166 * auVar300._12_4_;
  auVar139._0_4_ = auVar12._0_4_ * fVar70;
  auVar139._4_4_ = auVar12._4_4_ * fVar85;
  auVar139._8_4_ = auVar12._8_4_ * fVar150;
  auVar139._12_4_ = auVar12._12_4_ * fVar166;
  auVar215._0_4_ = auVar104._0_4_ * fVar70;
  auVar215._4_4_ = auVar104._4_4_ * fVar85;
  auVar215._8_4_ = auVar104._8_4_ * fVar150;
  auVar215._12_4_ = auVar104._12_4_ * fVar166;
  auVar73 = vfmadd231ps_fma(auVar261,auVar87,auVar9);
  auVar88 = vfmadd231ps_fma(auVar139,auVar87,auVar11);
  auVar87 = vfmadd231ps_fma(auVar215,auVar74,auVar87);
  auVar118 = vfmadd231ps_fma(auVar73,auVar295,auVar8);
  auVar88 = vfmadd231ps_fma(auVar88,auVar295,auVar10);
  auVar134 = vfmadd231ps_fma(auVar87,auVar75,auVar295);
  auVar296._4_4_ = auVar72._0_4_;
  auVar296._0_4_ = auVar72._0_4_;
  auVar296._8_4_ = auVar72._0_4_;
  auVar296._12_4_ = auVar72._0_4_;
  auVar87 = vshufps_avx(auVar72,auVar72,0x55);
  auVar73 = vshufps_avx(auVar72,auVar72,0xaa);
  fVar70 = auVar73._0_4_;
  auVar152._0_4_ = fVar70 * auVar300._0_4_;
  fVar85 = auVar73._4_4_;
  auVar152._4_4_ = fVar85 * auVar300._4_4_;
  fVar150 = auVar73._8_4_;
  auVar152._8_4_ = fVar150 * auVar300._8_4_;
  fVar166 = auVar73._12_4_;
  auVar152._12_4_ = fVar166 * auVar300._12_4_;
  auVar86._0_4_ = auVar12._0_4_ * fVar70;
  auVar86._4_4_ = auVar12._4_4_ * fVar85;
  auVar86._8_4_ = auVar12._8_4_ * fVar150;
  auVar86._12_4_ = auVar12._12_4_ * fVar166;
  auVar73._0_4_ = auVar104._0_4_ * fVar70;
  auVar73._4_4_ = auVar104._4_4_ * fVar85;
  auVar73._8_4_ = auVar104._8_4_ * fVar150;
  auVar73._12_4_ = auVar104._12_4_ * fVar166;
  auVar9 = vfmadd231ps_fma(auVar152,auVar87,auVar9);
  auVar300 = vfmadd231ps_fma(auVar86,auVar87,auVar11);
  auVar11 = vfmadd231ps_fma(auVar73,auVar87,auVar74);
  auVar12 = vfmadd231ps_fma(auVar9,auVar296,auVar8);
  auVar74 = vfmadd231ps_fma(auVar300,auVar296,auVar10);
  auVar104 = vfmadd231ps_fma(auVar11,auVar296,auVar75);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar118,auVar200);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar110,1);
  auVar9 = vblendvps_avx(auVar118,auVar110,auVar8);
  auVar8 = vandps_avx(auVar88,auVar200);
  auVar8 = vcmpps_avx(auVar8,auVar110,1);
  auVar300 = vblendvps_avx(auVar88,auVar110,auVar8);
  auVar8 = vandps_avx(auVar134,auVar200);
  auVar8 = vcmpps_avx(auVar8,auVar110,1);
  auVar8 = vblendvps_avx(auVar134,auVar110,auVar8);
  auVar10 = vrcpps_avx(auVar9);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = &DAT_3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar222);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar300);
  auVar300 = vfnmadd213ps_fma(auVar300,auVar9,auVar222);
  auVar11 = vfmadd132ps_fma(auVar300,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar300 = vfnmadd213ps_fma(auVar8,auVar9,auVar222);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar75 = vfmadd132ps_fma(auVar300,auVar9,auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar12);
  auVar134._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar134._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar134._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar134._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar12);
  auVar153._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar153._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar153._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar153._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar88._1_3_ = 0;
  auVar88[0] = PVar3;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar300);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar67 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar10);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar74);
  auVar216._0_4_ = auVar8._0_4_ * auVar11._0_4_;
  auVar216._4_4_ = auVar8._4_4_ * auVar11._4_4_;
  auVar216._8_4_ = auVar8._8_4_ * auVar11._8_4_;
  auVar216._12_4_ = auVar8._12_4_ * auVar11._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar9);
  auVar8 = vsubps_avx(auVar8,auVar74);
  auVar87._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar87._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar87._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar87._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar61 + uVar67 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar104);
  auVar118._0_4_ = auVar75._0_4_ * auVar8._0_4_;
  auVar118._4_4_ = auVar75._4_4_ * auVar8._4_4_;
  auVar118._8_4_ = auVar75._8_4_ * auVar8._8_4_;
  auVar118._12_4_ = auVar75._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar104);
  auVar74._0_4_ = auVar75._0_4_ * auVar8._0_4_;
  auVar74._4_4_ = auVar75._4_4_ * auVar8._4_4_;
  auVar74._8_4_ = auVar75._8_4_ * auVar8._8_4_;
  auVar74._12_4_ = auVar75._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar134,auVar153);
  auVar9 = vpminsd_avx(auVar216,auVar87);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar118,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar235._4_4_ = uVar71;
  auVar235._0_4_ = uVar71;
  auVar235._8_4_ = uVar71;
  auVar235._12_4_ = uVar71;
  auVar9 = vmaxps_avx(auVar9,auVar235);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_460._0_4_ = auVar8._0_4_ * 0.99999964;
  local_460._4_4_ = auVar8._4_4_ * 0.99999964;
  local_460._8_4_ = auVar8._8_4_ * 0.99999964;
  local_460._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar134,auVar153);
  auVar9 = vpmaxsd_avx(auVar216,auVar87);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar118,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar104._4_4_ = uVar71;
  auVar104._0_4_ = uVar71;
  auVar104._8_4_ = uVar71;
  auVar104._12_4_ = uVar71;
  auVar9 = vminps_avx(auVar9,auVar104);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar75._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar88[4] = PVar3;
  auVar88._5_3_ = 0;
  auVar88[8] = PVar3;
  auVar88._9_3_ = 0;
  auVar88[0xc] = PVar3;
  auVar88._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar88,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_460,auVar75,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar57 = vmovmskps_avx(auVar8);
  local_771 = uVar57 != 0;
  if (uVar57 == 0) {
    return local_771;
  }
  uVar57 = uVar57 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_3a0 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  iVar58 = 1 << ((uint)k & 0x1f);
  auVar83._4_4_ = iVar58;
  auVar83._0_4_ = iVar58;
  auVar83._8_4_ = iVar58;
  auVar83._12_4_ = iVar58;
  auVar83._16_4_ = iVar58;
  auVar83._20_4_ = iVar58;
  auVar83._24_4_ = iVar58;
  auVar83._28_4_ = iVar58;
  auVar84 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar82 = vpand_avx2(auVar83,auVar84);
  local_360 = vpcmpeqd_avx2(auVar82,auVar84);
LAB_016dba96:
  lVar63 = 0;
  uVar67 = (ulong)uVar57;
  for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  uVar57 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar63 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar57].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_340);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var7 + uVar61 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar61 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar61 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar61 + 3));
  fVar70 = *pfVar1;
  fVar85 = pfVar1[1];
  fVar150 = pfVar1[2];
  fVar166 = pfVar1[3];
  lVar63 = *(long *)&pGVar4[1].time_range.upper;
  auVar300 = *(undefined1 (*) [16])(lVar63 + (long)p_Var5 * uVar61);
  auVar10 = *(undefined1 (*) [16])(lVar63 + (long)p_Var5 * (uVar61 + 1));
  auVar11 = *(undefined1 (*) [16])(lVar63 + (long)p_Var5 * (uVar61 + 2));
  uVar67 = uVar67 - 1 & uVar67;
  pfVar1 = (float *)(lVar63 + (long)p_Var5 * (uVar61 + 3));
  fVar169 = *pfVar1;
  fVar190 = pfVar1[1];
  fVar192 = pfVar1[2];
  fVar194 = pfVar1[3];
  if (uVar67 != 0) {
    uVar66 = uVar67 - 1 & uVar67;
    for (uVar61 = uVar67; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar66 != 0) {
      for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar305._8_4_ = 0x80000000;
  auVar305._0_8_ = 0x8000000080000000;
  auVar305._12_4_ = 0x80000000;
  auVar119._0_4_ = fVar169 * -0.0;
  auVar119._4_4_ = fVar190 * -0.0;
  auVar119._8_4_ = fVar192 * -0.0;
  auVar119._12_4_ = fVar194 * -0.0;
  auVar74 = vfmadd213ps_fma((undefined1  [16])0x0,auVar11,auVar119);
  auVar76._0_4_ = auVar10._0_4_ + auVar74._0_4_;
  auVar76._4_4_ = auVar10._4_4_ + auVar74._4_4_;
  auVar76._8_4_ = auVar10._8_4_ + auVar74._8_4_;
  auVar76._12_4_ = auVar10._12_4_ + auVar74._12_4_;
  auVar104 = vfmadd231ps_fma(auVar76,auVar300,auVar305);
  auVar89._12_4_ = 0;
  auVar89._0_12_ = ZEXT812(0);
  auVar89 = auVar89 << 0x20;
  auVar105._0_4_ = fVar169 * 0.0;
  auVar105._4_4_ = fVar190 * 0.0;
  auVar105._8_4_ = fVar192 * 0.0;
  auVar105._12_4_ = fVar194 * 0.0;
  auVar217._8_4_ = 0x3f000000;
  auVar217._0_8_ = 0x3f0000003f000000;
  auVar217._12_4_ = 0x3f000000;
  auVar74 = vfmadd231ps_fma(auVar105,auVar11,auVar217);
  auVar74 = vfmadd231ps_fma(auVar74,auVar10,auVar89);
  auVar88 = vfnmadd231ps_fma(auVar74,auVar300,auVar217);
  auVar297._0_4_ = fVar70 * -0.0;
  auVar297._4_4_ = fVar85 * -0.0;
  auVar297._8_4_ = fVar150 * -0.0;
  auVar297._12_4_ = fVar166 * -0.0;
  auVar74 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar9,auVar297);
  auVar285._0_4_ = auVar8._0_4_ + auVar74._0_4_;
  auVar285._4_4_ = auVar8._4_4_ + auVar74._4_4_;
  auVar285._8_4_ = auVar8._8_4_ + auVar74._8_4_;
  auVar285._12_4_ = auVar8._12_4_ + auVar74._12_4_;
  auVar74 = vfmadd231ps_fma(auVar285,auVar12,auVar305);
  auVar270._0_4_ = fVar70 * 0.0;
  auVar270._4_4_ = fVar85 * 0.0;
  auVar270._8_4_ = fVar150 * 0.0;
  auVar270._12_4_ = fVar166 * 0.0;
  auVar87 = vfmadd231ps_fma(auVar270,auVar9,auVar217);
  auVar87 = vfmadd231ps_fma(auVar87,auVar8,auVar89);
  auVar118 = vfnmadd231ps_fma(auVar87,auVar12,auVar217);
  auVar120._0_4_ = auVar11._0_4_ + auVar119._0_4_;
  auVar120._4_4_ = auVar11._4_4_ + auVar119._4_4_;
  auVar120._8_4_ = auVar11._8_4_ + auVar119._8_4_;
  auVar120._12_4_ = auVar11._12_4_ + auVar119._12_4_;
  auVar87 = vfmadd231ps_fma(auVar120,auVar10,auVar89);
  auVar87 = vfmadd231ps_fma(auVar87,auVar300,auVar305);
  auVar135._0_4_ = fVar169 * 0.5;
  auVar135._4_4_ = fVar190 * 0.5;
  auVar135._8_4_ = fVar192 * 0.5;
  auVar135._12_4_ = fVar194 * 0.5;
  auVar11 = vfmadd231ps_fma(auVar135,auVar89,auVar11);
  auVar10 = vfnmadd231ps_fma(auVar11,auVar217,auVar10);
  auVar73 = vfmadd231ps_fma(auVar10,auVar89,auVar300);
  auVar236._0_4_ = auVar297._0_4_ + auVar9._0_4_;
  auVar236._4_4_ = auVar297._4_4_ + auVar9._4_4_;
  auVar236._8_4_ = auVar297._8_4_ + auVar9._8_4_;
  auVar236._12_4_ = auVar297._12_4_ + auVar9._12_4_;
  auVar300 = vfmadd231ps_fma(auVar236,auVar8,auVar89);
  auVar11 = vfmadd231ps_fma(auVar300,auVar12,auVar305);
  auVar247._0_4_ = fVar70 * 0.5;
  auVar247._4_4_ = fVar85 * 0.5;
  auVar247._8_4_ = fVar150 * 0.5;
  auVar247._12_4_ = fVar166 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar247,auVar89,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar217,auVar8);
  auVar12 = vfmadd231ps_fma(auVar8,auVar89,auVar12);
  auVar8 = vshufps_avx(auVar88,auVar88,0xc9);
  auVar9 = vshufps_avx(auVar74,auVar74,0xc9);
  fVar167 = auVar88._0_4_;
  auVar173._0_4_ = fVar167 * auVar9._0_4_;
  fVar168 = auVar88._4_4_;
  auVar173._4_4_ = fVar168 * auVar9._4_4_;
  fVar102 = auVar88._8_4_;
  auVar173._8_4_ = fVar102 * auVar9._8_4_;
  fVar103 = auVar88._12_4_;
  auVar173._12_4_ = fVar103 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar173,auVar8,auVar74);
  auVar300 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar174._0_4_ = fVar167 * auVar9._0_4_;
  auVar174._4_4_ = fVar168 * auVar9._4_4_;
  auVar174._8_4_ = fVar102 * auVar9._8_4_;
  auVar174._12_4_ = fVar103 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar174,auVar8,auVar118);
  auVar10 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar171 = auVar73._0_4_;
  auVar154._0_4_ = fVar171 * auVar9._0_4_;
  fVar133 = auVar73._4_4_;
  auVar154._4_4_ = fVar133 * auVar9._4_4_;
  fVar148 = auVar73._8_4_;
  auVar154._8_4_ = fVar148 * auVar9._8_4_;
  fVar149 = auVar73._12_4_;
  auVar154._12_4_ = fVar149 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar154,auVar8,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar201._0_4_ = fVar171 * auVar9._0_4_;
  auVar201._4_4_ = fVar133 * auVar9._4_4_;
  auVar201._8_4_ = fVar148 * auVar9._8_4_;
  auVar201._12_4_ = fVar149 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar201,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar300,auVar300,0x7f);
  fVar85 = auVar8._0_4_;
  auVar74 = ZEXT416((uint)fVar85);
  auVar9 = vrsqrtss_avx(auVar74,auVar74);
  fVar70 = auVar9._0_4_;
  fVar70 = fVar70 * 1.5 + fVar85 * -0.5 * fVar70 * fVar70 * fVar70;
  auVar9 = vdpps_avx(auVar300,auVar10,0x7f);
  fVar169 = auVar300._0_4_ * fVar70;
  fVar190 = auVar300._4_4_ * fVar70;
  fVar192 = auVar300._8_4_ * fVar70;
  fVar194 = auVar300._12_4_ * fVar70;
  auVar262._0_4_ = auVar10._0_4_ * fVar85;
  auVar262._4_4_ = auVar10._4_4_ * fVar85;
  auVar262._8_4_ = auVar10._8_4_ * fVar85;
  auVar262._12_4_ = auVar10._12_4_ * fVar85;
  fVar85 = auVar9._0_4_;
  auVar218._0_4_ = auVar300._0_4_ * fVar85;
  auVar218._4_4_ = auVar300._4_4_ * fVar85;
  auVar218._8_4_ = auVar300._8_4_ * fVar85;
  auVar218._12_4_ = auVar300._12_4_ * fVar85;
  auVar300 = vsubps_avx(auVar262,auVar218);
  auVar9 = vrcpss_avx(auVar74,auVar74);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar150 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar166 = auVar8._0_4_;
  auVar74 = ZEXT416((uint)fVar166);
  auVar9 = vrsqrtss_avx(auVar74,auVar74);
  fVar85 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar85 = fVar85 * 1.5 + fVar166 * -0.5 * fVar85 * fVar85 * fVar85;
  fVar269 = fVar85 * auVar11._0_4_;
  fVar282 = fVar85 * auVar11._4_4_;
  fVar283 = fVar85 * auVar11._8_4_;
  fVar284 = fVar85 * auVar11._12_4_;
  auVar202._0_4_ = fVar166 * auVar12._0_4_;
  auVar202._4_4_ = fVar166 * auVar12._4_4_;
  auVar202._8_4_ = fVar166 * auVar12._8_4_;
  auVar202._12_4_ = fVar166 * auVar12._12_4_;
  fVar166 = auVar9._0_4_;
  auVar155._0_4_ = fVar166 * auVar11._0_4_;
  auVar155._4_4_ = fVar166 * auVar11._4_4_;
  auVar155._8_4_ = fVar166 * auVar11._8_4_;
  auVar155._12_4_ = fVar166 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar202,auVar155);
  auVar9 = vrcpss_avx(auVar74,auVar74);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar166 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar104,auVar104,0xff);
  auVar237._0_4_ = auVar8._0_4_ * fVar169;
  auVar237._4_4_ = auVar8._4_4_ * fVar190;
  auVar237._8_4_ = auVar8._8_4_ * fVar192;
  auVar237._12_4_ = auVar8._12_4_ * fVar194;
  auVar74 = vsubps_avx(auVar104,auVar237);
  auVar9 = vshufps_avx(auVar88,auVar88,0xff);
  auVar175._0_4_ = auVar9._0_4_ * fVar169 + fVar70 * auVar300._0_4_ * fVar150 * auVar8._0_4_;
  auVar175._4_4_ = auVar9._4_4_ * fVar190 + fVar70 * auVar300._4_4_ * fVar150 * auVar8._4_4_;
  auVar175._8_4_ = auVar9._8_4_ * fVar192 + fVar70 * auVar300._8_4_ * fVar150 * auVar8._8_4_;
  auVar175._12_4_ = auVar9._12_4_ * fVar194 + fVar70 * auVar300._12_4_ * fVar150 * auVar8._12_4_;
  auVar300 = vsubps_avx(auVar88,auVar175);
  auVar248._0_4_ = auVar237._0_4_ + auVar104._0_4_;
  auVar248._4_4_ = auVar237._4_4_ + auVar104._4_4_;
  auVar248._8_4_ = auVar237._8_4_ + auVar104._8_4_;
  auVar248._12_4_ = auVar237._12_4_ + auVar104._12_4_;
  auVar8 = vshufps_avx(auVar87,auVar87,0xff);
  auVar106._0_4_ = fVar269 * auVar8._0_4_;
  auVar106._4_4_ = fVar282 * auVar8._4_4_;
  auVar106._8_4_ = fVar283 * auVar8._8_4_;
  auVar106._12_4_ = fVar284 * auVar8._12_4_;
  auVar104 = vsubps_avx(auVar87,auVar106);
  auVar9 = vshufps_avx(auVar73,auVar73,0xff);
  auVar90._0_4_ = fVar269 * auVar9._0_4_ + auVar8._0_4_ * fVar85 * auVar10._0_4_ * fVar166;
  auVar90._4_4_ = fVar282 * auVar9._4_4_ + auVar8._4_4_ * fVar85 * auVar10._4_4_ * fVar166;
  auVar90._8_4_ = fVar283 * auVar9._8_4_ + auVar8._8_4_ * fVar85 * auVar10._8_4_ * fVar166;
  auVar90._12_4_ = fVar284 * auVar9._12_4_ + auVar8._12_4_ * fVar85 * auVar10._12_4_ * fVar166;
  auVar8 = vsubps_avx(auVar73,auVar90);
  fVar169 = auVar87._0_4_ + auVar106._0_4_;
  fVar190 = auVar87._4_4_ + auVar106._4_4_;
  fVar192 = auVar87._8_4_ + auVar106._8_4_;
  fVar194 = auVar87._12_4_ + auVar106._12_4_;
  auVar121._0_4_ = auVar74._0_4_ + auVar300._0_4_ * 0.33333334;
  auVar121._4_4_ = auVar74._4_4_ + auVar300._4_4_ * 0.33333334;
  auVar121._8_4_ = auVar74._8_4_ + auVar300._8_4_ * 0.33333334;
  auVar121._12_4_ = auVar74._12_4_ + auVar300._12_4_ * 0.33333334;
  auVar91._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar91._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar91._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar91._12_4_ = auVar8._12_4_ * 0.33333334;
  auVar87 = vsubps_avx(auVar104,auVar91);
  auVar73 = vsubps_avx(auVar74,auVar75);
  auVar8 = vshufps_avx(auVar73,auVar73,0x55);
  auVar9 = vshufps_avx(auVar73,auVar73,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar70 = pre->ray_space[k].vz.field_0.m128[0];
  fVar85 = pre->ray_space[k].vz.field_0.m128[1];
  fVar150 = pre->ray_space[k].vz.field_0.m128[2];
  fVar166 = pre->ray_space[k].vz.field_0.m128[3];
  auVar92._0_4_ = fVar70 * auVar9._0_4_;
  auVar92._4_4_ = fVar85 * auVar9._4_4_;
  auVar92._8_4_ = fVar150 * auVar9._8_4_;
  auVar92._12_4_ = fVar166 * auVar9._12_4_;
  auVar300 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar2,auVar8);
  auVar88 = vsubps_avx(auVar121,auVar75);
  auVar8 = vshufps_avx(auVar88,auVar88,0x55);
  auVar9 = vshufps_avx(auVar88,auVar88,0xaa);
  auVar306._0_4_ = fVar70 * auVar9._0_4_;
  auVar306._4_4_ = fVar85 * auVar9._4_4_;
  auVar306._8_4_ = fVar150 * auVar9._8_4_;
  auVar306._12_4_ = fVar166 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar306,(undefined1  [16])aVar2,auVar8);
  local_3f0 = vsubps_avx(auVar87,auVar75);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar271._0_4_ = fVar70 * auVar8._0_4_;
  auVar271._4_4_ = fVar85 * auVar8._4_4_;
  auVar271._8_4_ = fVar150 * auVar8._8_4_;
  auVar271._12_4_ = fVar166 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar10 = vfmadd231ps_fma(auVar271,(undefined1  [16])aVar2,auVar8);
  local_400 = vsubps_avx(auVar104,auVar75);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar298._0_4_ = fVar70 * auVar8._0_4_;
  auVar298._4_4_ = fVar85 * auVar8._4_4_;
  auVar298._8_4_ = fVar150 * auVar8._8_4_;
  auVar298._12_4_ = fVar166 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar11 = vfmadd231ps_fma(auVar298,(undefined1  [16])aVar2,auVar8);
  local_410 = vsubps_avx(auVar248,auVar75);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar156._0_4_ = fVar70 * auVar8._0_4_;
  auVar156._4_4_ = fVar85 * auVar8._4_4_;
  auVar156._8_4_ = fVar150 * auVar8._8_4_;
  auVar156._12_4_ = fVar166 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar12 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar2,auVar8);
  auVar77._0_4_ = (fVar167 + auVar175._0_4_) * 0.33333334 + auVar248._0_4_;
  auVar77._4_4_ = (fVar168 + auVar175._4_4_) * 0.33333334 + auVar248._4_4_;
  auVar77._8_4_ = (fVar102 + auVar175._8_4_) * 0.33333334 + auVar248._8_4_;
  auVar77._12_4_ = (fVar103 + auVar175._12_4_) * 0.33333334 + auVar248._12_4_;
  local_420 = vsubps_avx(auVar77,auVar75);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar219._0_4_ = auVar8._0_4_ * fVar70;
  auVar219._4_4_ = auVar8._4_4_ * fVar85;
  auVar219._8_4_ = auVar8._8_4_ * fVar150;
  auVar219._12_4_ = auVar8._12_4_ * fVar166;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar134 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar8);
  auVar238._0_4_ = (fVar171 + auVar90._0_4_) * 0.33333334;
  auVar238._4_4_ = (fVar133 + auVar90._4_4_) * 0.33333334;
  auVar238._8_4_ = (fVar148 + auVar90._8_4_) * 0.33333334;
  auVar238._12_4_ = (fVar149 + auVar90._12_4_) * 0.33333334;
  auVar18._4_4_ = fVar190;
  auVar18._0_4_ = fVar169;
  auVar18._8_4_ = fVar192;
  auVar18._12_4_ = fVar194;
  auVar118 = vsubps_avx(auVar18,auVar238);
  local_430 = vsubps_avx(auVar118,auVar75);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar239._0_4_ = auVar8._0_4_ * fVar70;
  auVar239._4_4_ = auVar8._4_4_ * fVar85;
  auVar239._8_4_ = auVar8._8_4_ * fVar150;
  auVar239._12_4_ = auVar8._12_4_ * fVar166;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar72 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar2,auVar8);
  local_440 = vsubps_avx(auVar18,auVar75);
  auVar8 = vshufps_avx(local_440,local_440,0xaa);
  auVar78._0_4_ = fVar70 * auVar8._0_4_;
  auVar78._4_4_ = fVar85 * auVar8._4_4_;
  auVar78._8_4_ = fVar150 * auVar8._8_4_;
  auVar78._12_4_ = fVar166 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_440,local_440,0x55);
  auVar8 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar8);
  local_5a0 = auVar73._0_4_;
  auVar176._4_4_ = local_5a0;
  auVar176._0_4_ = local_5a0;
  auVar176._8_4_ = local_5a0;
  auVar176._12_4_ = local_5a0;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar75 = vfmadd231ps_fma(auVar300,(undefined1  [16])aVar2,auVar176);
  local_5b0 = auVar88._0_4_;
  auVar177._4_4_ = local_5b0;
  auVar177._0_4_ = local_5b0;
  auVar177._8_4_ = local_5b0;
  auVar177._12_4_ = local_5b0;
  auVar86 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar177);
  uVar71 = local_3f0._0_4_;
  auVar178._4_4_ = uVar71;
  auVar178._0_4_ = uVar71;
  auVar178._8_4_ = uVar71;
  auVar178._12_4_ = uVar71;
  auVar110 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar178);
  uVar71 = local_400._0_4_;
  auVar179._4_4_ = uVar71;
  auVar179._0_4_ = uVar71;
  auVar179._8_4_ = uVar71;
  auVar179._12_4_ = uVar71;
  auVar151 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar179);
  uVar71 = local_410._0_4_;
  auVar180._4_4_ = uVar71;
  auVar180._0_4_ = uVar71;
  auVar180._8_4_ = uVar71;
  auVar180._12_4_ = uVar71;
  auVar152 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar180);
  uVar71 = local_420._0_4_;
  auVar181._4_4_ = uVar71;
  auVar181._0_4_ = uVar71;
  auVar181._8_4_ = uVar71;
  auVar181._12_4_ = uVar71;
  auVar134 = vfmadd231ps_fma(auVar134,(undefined1  [16])aVar2,auVar181);
  uVar71 = local_430._0_4_;
  auVar182._4_4_ = uVar71;
  auVar182._0_4_ = uVar71;
  auVar182._8_4_ = uVar71;
  auVar182._12_4_ = uVar71;
  auVar72 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar182);
  uVar71 = local_440._0_4_;
  auVar183._4_4_ = uVar71;
  auVar183._0_4_ = uVar71;
  auVar183._8_4_ = uVar71;
  auVar183._12_4_ = uVar71;
  auVar153 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar183);
  auVar10 = vmovlhps_avx(auVar75,auVar152);
  auVar11 = vmovlhps_avx(auVar86,auVar134);
  auVar12 = vmovlhps_avx(auVar110,auVar72);
  _local_3e0 = vmovlhps_avx(auVar151,auVar153);
  auVar8 = vminps_avx(auVar10,auVar11);
  auVar9 = vminps_avx(auVar12,_local_3e0);
  auVar300 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar10,auVar11);
  auVar9 = vmaxps_avx(auVar12,_local_3e0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar300,auVar300,3);
  auVar300 = vminps_avx(auVar300,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar200,auVar300);
  auVar9 = vandps_avx(auVar200,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  fVar85 = auVar8._0_4_ * 9.536743e-07;
  auVar286._8_8_ = auVar75._0_8_;
  auVar286._0_8_ = auVar75._0_8_;
  auVar249._8_8_ = auVar86._0_8_;
  auVar249._0_8_ = auVar86._0_8_;
  auVar272._0_8_ = auVar110._0_8_;
  auVar272._8_8_ = auVar272._0_8_;
  auVar136._8_8_ = auVar151._0_8_;
  auVar136._0_8_ = auVar151._0_8_;
  local_2e0 = fVar85;
  fStack_2dc = fVar85;
  fStack_2d8 = fVar85;
  fStack_2d4 = fVar85;
  fStack_2d0 = fVar85;
  fStack_2cc = fVar85;
  fStack_2c8 = fVar85;
  fStack_2c4 = fVar85;
  fStack_2f8 = -fVar85;
  local_300 = -fVar85;
  fStack_2fc = -fVar85;
  fStack_2f4 = fStack_2f8;
  fStack_2f0 = fStack_2f8;
  fStack_2ec = fStack_2f8;
  fStack_2e8 = fStack_2f8;
  fStack_2e4 = fStack_2f8;
  local_320 = uVar57;
  uStack_31c = uVar57;
  uStack_318 = uVar57;
  uStack_314 = uVar57;
  uStack_310 = uVar57;
  uStack_30c = uVar57;
  uStack_308 = uVar57;
  uStack_304 = uVar57;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar68 = false;
  uVar61 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x60);
  local_3b0 = vsubps_avx(auVar11,auVar10);
  local_3c0 = vsubps_avx(auVar12,auVar11);
  local_3d0 = vsubps_avx(_local_3e0,auVar12);
  local_470 = vsubps_avx(auVar248,auVar74);
  local_480 = vsubps_avx(auVar77,auVar121);
  local_490 = vsubps_avx(auVar118,auVar87);
  auVar240._4_4_ = fVar190;
  auVar240._0_4_ = fVar169;
  auVar240._8_4_ = fVar192;
  auVar240._12_4_ = fVar194;
  _local_4a0 = vsubps_avx(auVar240,auVar104);
  local_450 = ZEXT816(0x3f80000000000000);
  auVar311 = ZEXT1664(local_450);
  do {
    auVar296 = auVar311._0_16_;
    auVar8 = vshufps_avx(auVar296,auVar296,0x50);
    auVar122._8_4_ = 0x3f800000;
    auVar122._0_8_ = &DAT_3f8000003f800000;
    auVar122._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._0_16_ = auVar122;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar122,auVar8);
    fVar150 = auVar8._0_4_;
    fVar148 = auVar152._0_4_;
    auVar79._0_4_ = fVar148 * fVar150;
    fVar166 = auVar8._4_4_;
    fVar149 = auVar152._4_4_;
    auVar79._4_4_ = fVar149 * fVar166;
    fVar167 = auVar8._8_4_;
    auVar79._8_4_ = fVar148 * fVar167;
    fVar168 = auVar8._12_4_;
    auVar79._12_4_ = fVar149 * fVar168;
    fVar199 = auVar134._0_4_;
    auVar157._0_4_ = fVar199 * fVar150;
    fVar213 = auVar134._4_4_;
    auVar157._4_4_ = fVar213 * fVar166;
    auVar157._8_4_ = fVar199 * fVar167;
    auVar157._12_4_ = fVar213 * fVar168;
    fVar214 = auVar72._0_4_;
    auVar203._0_4_ = fVar214 * fVar150;
    fVar233 = auVar72._4_4_;
    auVar203._4_4_ = fVar233 * fVar166;
    auVar203._8_4_ = fVar214 * fVar167;
    auVar203._12_4_ = fVar233 * fVar168;
    fVar234 = auVar153._0_4_;
    auVar299._0_4_ = fVar234 * fVar150;
    fVar246 = auVar153._4_4_;
    auVar299._4_4_ = fVar246 * fVar166;
    auVar299._8_4_ = fVar234 * fVar167;
    auVar299._12_4_ = fVar246 * fVar168;
    auVar86 = vfmadd231ps_fma(auVar79,auVar9,auVar286);
    auVar110 = vfmadd231ps_fma(auVar157,auVar9,auVar249);
    auVar151 = vfmadd231ps_fma(auVar203,auVar9,auVar272);
    auVar222 = vfmadd231ps_fma(auVar299,auVar136,auVar9);
    local_6e0 = auVar222._0_4_;
    auVar8 = vmovshdup_avx(local_450);
    fVar150 = local_450._0_4_;
    fVar102 = (auVar8._0_4_ - fVar150) * 0.04761905;
    auVar232._4_4_ = fVar150;
    auVar232._0_4_ = fVar150;
    auVar232._8_4_ = fVar150;
    auVar232._12_4_ = fVar150;
    auVar232._16_4_ = fVar150;
    auVar232._20_4_ = fVar150;
    auVar232._24_4_ = fVar150;
    auVar232._28_4_ = fVar150;
    auVar114._0_8_ = auVar8._0_8_;
    auVar114._8_8_ = auVar114._0_8_;
    auVar114._16_8_ = auVar114._0_8_;
    auVar114._24_8_ = auVar114._0_8_;
    auVar82 = vsubps_avx(auVar114,auVar232);
    uVar71 = auVar86._0_4_;
    auVar310._4_4_ = uVar71;
    auVar310._0_4_ = uVar71;
    auVar310._8_4_ = uVar71;
    auVar310._12_4_ = uVar71;
    auVar310._16_4_ = uVar71;
    auVar310._20_4_ = uVar71;
    auVar310._24_4_ = uVar71;
    auVar310._28_4_ = uVar71;
    auVar8 = vmovshdup_avx(auVar86);
    uVar172 = auVar8._0_8_;
    auVar293._8_8_ = uVar172;
    auVar293._0_8_ = uVar172;
    auVar293._16_8_ = uVar172;
    auVar293._24_8_ = uVar172;
    fVar103 = auVar110._0_4_;
    auVar100._4_4_ = fVar103;
    auVar100._0_4_ = fVar103;
    auVar100._8_4_ = fVar103;
    auVar100._12_4_ = fVar103;
    auVar100._16_4_ = fVar103;
    auVar100._20_4_ = fVar103;
    auVar100._24_4_ = fVar103;
    auVar100._28_4_ = fVar103;
    auVar9 = vmovshdup_avx(auVar110);
    auVar187._0_8_ = auVar9._0_8_;
    auVar187._8_8_ = auVar187._0_8_;
    auVar187._16_8_ = auVar187._0_8_;
    auVar187._24_8_ = auVar187._0_8_;
    fVar269 = auVar151._0_4_;
    auVar268._4_4_ = fVar269;
    auVar268._0_4_ = fVar269;
    auVar268._8_4_ = fVar269;
    auVar268._12_4_ = fVar269;
    auVar268._16_4_ = fVar269;
    auVar268._20_4_ = fVar269;
    auVar268._24_4_ = fVar269;
    auVar268._28_4_ = fVar269;
    auVar300 = vmovshdup_avx(auVar151);
    auVar245._0_8_ = auVar300._0_8_;
    auVar245._8_8_ = auVar245._0_8_;
    auVar245._16_8_ = auVar245._0_8_;
    auVar245._24_8_ = auVar245._0_8_;
    auVar75 = vmovshdup_avx(auVar222);
    auVar215 = vfmadd132ps_fma(auVar82,auVar232,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar130,ZEXT1632(auVar215));
    fVar150 = auVar215._0_4_;
    auVar302._0_4_ = fVar103 * fVar150;
    fVar166 = auVar215._4_4_;
    auVar302._4_4_ = fVar103 * fVar166;
    fVar167 = auVar215._8_4_;
    auVar302._8_4_ = fVar103 * fVar167;
    fVar168 = auVar215._12_4_;
    auVar302._12_4_ = fVar103 * fVar168;
    auVar302._16_4_ = fVar103 * 0.0;
    auVar302._20_4_ = fVar103 * 0.0;
    auVar302._24_4_ = fVar103 * 0.0;
    auVar302._28_4_ = 0;
    auVar215 = vfmadd231ps_fma(auVar302,auVar82,auVar310);
    fVar171 = auVar9._0_4_;
    auVar279._0_4_ = fVar171 * fVar150;
    fVar133 = auVar9._4_4_;
    auVar279._4_4_ = fVar133 * fVar166;
    auVar279._8_4_ = fVar171 * fVar167;
    auVar279._12_4_ = fVar133 * fVar168;
    auVar279._16_4_ = fVar171 * 0.0;
    auVar279._20_4_ = fVar133 * 0.0;
    auVar279._24_4_ = fVar171 * 0.0;
    auVar279._28_4_ = 0;
    auVar216 = vfmadd231ps_fma(auVar279,auVar82,auVar293);
    auVar84._4_4_ = fVar269 * fVar166;
    auVar84._0_4_ = fVar269 * fVar150;
    auVar84._8_4_ = fVar269 * fVar167;
    auVar84._12_4_ = fVar269 * fVar168;
    auVar84._16_4_ = fVar269 * 0.0;
    auVar84._20_4_ = fVar269 * 0.0;
    auVar84._24_4_ = fVar269 * 0.0;
    auVar84._28_4_ = auVar8._4_4_;
    auVar235 = vfmadd231ps_fma(auVar84,auVar82,auVar100);
    fVar171 = auVar300._0_4_;
    fVar133 = auVar300._4_4_;
    auVar13._4_4_ = fVar133 * fVar166;
    auVar13._0_4_ = fVar171 * fVar150;
    auVar13._8_4_ = fVar171 * fVar167;
    auVar13._12_4_ = fVar133 * fVar168;
    auVar13._16_4_ = fVar171 * 0.0;
    auVar13._20_4_ = fVar133 * 0.0;
    auVar13._24_4_ = fVar171 * 0.0;
    auVar13._28_4_ = uVar71;
    auVar139 = vfmadd231ps_fma(auVar13,auVar82,auVar187);
    auVar8 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar188._0_8_ = auVar8._0_8_;
    auVar188._8_8_ = auVar188._0_8_;
    auVar188._16_8_ = auVar188._0_8_;
    auVar188._24_8_ = auVar188._0_8_;
    auVar9 = vshufps_avx(auVar86,auVar86,0xff);
    uStack_6f8 = auVar9._0_8_;
    local_700 = (undefined1  [8])uStack_6f8;
    uStack_6f0 = uStack_6f8;
    uStack_6e8 = uStack_6f8;
    auVar14._4_4_ = fVar166 * local_6e0;
    auVar14._0_4_ = fVar150 * local_6e0;
    auVar14._8_4_ = fVar167 * local_6e0;
    auVar14._12_4_ = fVar168 * local_6e0;
    auVar14._16_4_ = local_6e0 * 0.0;
    auVar14._20_4_ = local_6e0 * 0.0;
    auVar14._24_4_ = local_6e0 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar261 = vfmadd231ps_fma(auVar14,auVar82,auVar268);
    auVar300 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar146._0_8_ = auVar300._0_8_;
    auVar146._8_8_ = auVar146._0_8_;
    auVar146._16_8_ = auVar146._0_8_;
    auVar146._24_8_ = auVar146._0_8_;
    auVar86 = vshufps_avx(auVar110,auVar110,0xff);
    auVar165._0_8_ = auVar86._0_8_;
    auVar165._8_8_ = auVar165._0_8_;
    auVar165._16_8_ = auVar165._0_8_;
    auVar165._24_8_ = auVar165._0_8_;
    fVar171 = auVar75._0_4_;
    fVar133 = auVar75._4_4_;
    auVar15._4_4_ = fVar133 * fVar166;
    auVar15._0_4_ = fVar171 * fVar150;
    auVar15._8_4_ = fVar171 * fVar167;
    auVar15._12_4_ = fVar133 * fVar168;
    auVar15._16_4_ = fVar171 * 0.0;
    auVar15._20_4_ = fVar133 * 0.0;
    auVar15._24_4_ = fVar171 * 0.0;
    auVar15._28_4_ = fVar269;
    auVar295 = vfmadd231ps_fma(auVar15,auVar82,auVar245);
    auVar16._28_4_ = fVar103;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar235._12_4_ * fVar168,
                            CONCAT48(auVar235._8_4_ * fVar167,
                                     CONCAT44(auVar235._4_4_ * fVar166,auVar235._0_4_ * fVar150))));
    auVar215 = vfmadd231ps_fma(auVar16,auVar82,ZEXT1632(auVar215));
    auVar17._28_4_ = auVar9._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar139._12_4_ * fVar168,
                            CONCAT48(auVar139._8_4_ * fVar167,
                                     CONCAT44(auVar139._4_4_ * fVar166,auVar139._0_4_ * fVar150))));
    auVar216 = vfmadd231ps_fma(auVar17,auVar82,ZEXT1632(auVar216));
    auVar9 = vshufps_avx(auVar151,auVar151,0xaa);
    uVar172 = auVar9._0_8_;
    auVar280._8_8_ = uVar172;
    auVar280._0_8_ = uVar172;
    auVar280._16_8_ = uVar172;
    auVar280._24_8_ = uVar172;
    auVar75 = vshufps_avx(auVar151,auVar151,0xff);
    uVar172 = auVar75._0_8_;
    auVar303._8_8_ = uVar172;
    auVar303._0_8_ = uVar172;
    auVar303._16_8_ = uVar172;
    auVar303._24_8_ = uVar172;
    auVar235 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar261._12_4_,
                                                  CONCAT48(fVar167 * auVar261._8_4_,
                                                           CONCAT44(fVar166 * auVar261._4_4_,
                                                                    fVar150 * auVar261._0_4_)))),
                               auVar82,ZEXT1632(auVar235));
    auVar110 = vshufps_avx(auVar222,auVar222,0xaa);
    auVar151 = vshufps_avx(auVar222,auVar222,0xff);
    local_6e0 = auVar151._0_4_;
    fStack_6dc = auVar151._4_4_;
    auVar281._28_4_ = fStack_6dc;
    auVar281._0_28_ =
         ZEXT1628(CONCAT412(auVar295._12_4_ * fVar168,
                            CONCAT48(auVar295._8_4_ * fVar167,
                                     CONCAT44(auVar295._4_4_ * fVar166,auVar295._0_4_ * fVar150))));
    auVar151 = vfmadd231ps_fma(auVar281,auVar82,ZEXT1632(auVar139));
    auVar222 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar235._12_4_,
                                                  CONCAT48(fVar167 * auVar235._8_4_,
                                                           CONCAT44(fVar166 * auVar235._4_4_,
                                                                    fVar150 * auVar235._0_4_)))),
                               auVar82,ZEXT1632(auVar215));
    auVar84 = vsubps_avx(ZEXT1632(auVar235),ZEXT1632(auVar215));
    auVar215 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar151._12_4_,
                                                  CONCAT48(fVar167 * auVar151._8_4_,
                                                           CONCAT44(fVar166 * auVar151._4_4_,
                                                                    fVar150 * auVar151._0_4_)))),
                               auVar82,ZEXT1632(auVar216));
    auVar83 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar216));
    fVar284 = fVar102 * auVar84._0_4_ * 3.0;
    fVar255 = fVar102 * auVar84._4_4_ * 3.0;
    auVar19._4_4_ = fVar255;
    auVar19._0_4_ = fVar284;
    fVar256 = fVar102 * auVar84._8_4_ * 3.0;
    auVar19._8_4_ = fVar256;
    fVar257 = fVar102 * auVar84._12_4_ * 3.0;
    auVar19._12_4_ = fVar257;
    fVar258 = fVar102 * auVar84._16_4_ * 3.0;
    auVar19._16_4_ = fVar258;
    fVar259 = fVar102 * auVar84._20_4_ * 3.0;
    auVar19._20_4_ = fVar259;
    fVar260 = fVar102 * auVar84._24_4_ * 3.0;
    auVar19._24_4_ = fVar260;
    auVar19._28_4_ = 0x40400000;
    local_6a0._0_4_ = fVar102 * auVar83._0_4_ * 3.0;
    local_6a0._4_4_ = fVar102 * auVar83._4_4_ * 3.0;
    fStack_698 = fVar102 * auVar83._8_4_ * 3.0;
    fStack_694 = fVar102 * auVar83._12_4_ * 3.0;
    fStack_690 = fVar102 * auVar83._16_4_ * 3.0;
    fStack_68c = fVar102 * auVar83._20_4_ * 3.0;
    fStack_688 = fVar102 * auVar83._24_4_ * 3.0;
    fStack_684 = auVar83._28_4_;
    fVar103 = auVar300._0_4_;
    fVar171 = auVar300._4_4_;
    auVar20._4_4_ = fVar171 * fVar166;
    auVar20._0_4_ = fVar103 * fVar150;
    auVar20._8_4_ = fVar103 * fVar167;
    auVar20._12_4_ = fVar171 * fVar168;
    auVar20._16_4_ = fVar103 * 0.0;
    auVar20._20_4_ = fVar171 * 0.0;
    auVar20._24_4_ = fVar103 * 0.0;
    auVar20._28_4_ = auVar84._28_4_;
    auVar300 = vfmadd231ps_fma(auVar20,auVar82,auVar188);
    fVar103 = auVar86._0_4_;
    fVar133 = auVar86._4_4_;
    auVar21._4_4_ = fVar133 * fVar166;
    auVar21._0_4_ = fVar103 * fVar150;
    auVar21._8_4_ = fVar103 * fVar167;
    auVar21._12_4_ = fVar133 * fVar168;
    auVar21._16_4_ = fVar103 * 0.0;
    auVar21._20_4_ = fVar133 * 0.0;
    auVar21._24_4_ = fVar103 * 0.0;
    auVar21._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar21,auVar82,_local_700);
    fVar103 = auVar9._0_4_;
    fVar133 = auVar9._4_4_;
    auVar22._4_4_ = fVar133 * fVar166;
    auVar22._0_4_ = fVar103 * fVar150;
    auVar22._8_4_ = fVar103 * fVar167;
    auVar22._12_4_ = fVar133 * fVar168;
    auVar22._16_4_ = fVar103 * 0.0;
    auVar22._20_4_ = fVar133 * 0.0;
    auVar22._24_4_ = fVar103 * 0.0;
    auVar22._28_4_ = fVar102;
    auVar9 = vfmadd231ps_fma(auVar22,auVar82,auVar146);
    fVar103 = auVar75._0_4_;
    fVar269 = auVar75._4_4_;
    auVar23._4_4_ = fVar269 * fVar166;
    auVar23._0_4_ = fVar103 * fVar150;
    auVar23._8_4_ = fVar103 * fVar167;
    auVar23._12_4_ = fVar269 * fVar168;
    auVar23._16_4_ = fVar103 * 0.0;
    auVar23._20_4_ = fVar269 * 0.0;
    auVar23._24_4_ = fVar103 * 0.0;
    auVar23._28_4_ = fVar171;
    auVar75 = vfmadd231ps_fma(auVar23,auVar82,auVar165);
    local_4e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar222));
    fVar103 = auVar110._0_4_;
    fVar171 = auVar110._4_4_;
    auVar24._4_4_ = fVar171 * fVar166;
    auVar24._0_4_ = fVar103 * fVar150;
    auVar24._8_4_ = fVar103 * fVar167;
    auVar24._12_4_ = fVar171 * fVar168;
    auVar24._16_4_ = fVar103 * 0.0;
    auVar24._20_4_ = fVar171 * 0.0;
    auVar24._24_4_ = fVar103 * 0.0;
    auVar24._28_4_ = local_4e0._28_4_;
    auVar86 = vfmadd231ps_fma(auVar24,auVar82,auVar280);
    auVar15 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar215));
    auVar25._4_4_ = fVar166 * fStack_6dc;
    auVar25._0_4_ = fVar150 * local_6e0;
    auVar25._8_4_ = fVar167 * local_6e0;
    auVar25._12_4_ = fVar168 * fStack_6dc;
    auVar25._16_4_ = local_6e0 * 0.0;
    auVar25._20_4_ = fStack_6dc * 0.0;
    auVar25._24_4_ = local_6e0 * 0.0;
    auVar25._28_4_ = fVar133;
    auVar110 = vfmadd231ps_fma(auVar25,auVar82,auVar303);
    auVar26._28_4_ = fVar171;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar9._12_4_,
                            CONCAT48(fVar167 * auVar9._8_4_,
                                     CONCAT44(fVar166 * auVar9._4_4_,fVar150 * auVar9._0_4_))));
    auVar300 = vfmadd231ps_fma(auVar26,auVar82,ZEXT1632(auVar300));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar75._12_4_,
                                                CONCAT48(fVar167 * auVar75._8_4_,
                                                         CONCAT44(fVar166 * auVar75._4_4_,
                                                                  fVar150 * auVar75._0_4_)))),
                             auVar82,ZEXT1632(auVar8));
    fVar284 = auVar222._0_4_ + fVar284;
    fVar255 = auVar222._4_4_ + fVar255;
    fVar256 = auVar222._8_4_ + fVar256;
    fVar257 = auVar222._12_4_ + fVar257;
    fVar258 = fVar258 + 0.0;
    fVar259 = fVar259 + 0.0;
    fVar260 = fVar260 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar110._12_4_ * fVar168,
                            CONCAT48(auVar110._8_4_ * fVar167,
                                     CONCAT44(auVar110._4_4_ * fVar166,auVar110._0_4_ * fVar150))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar86._12_4_,
                                                CONCAT48(fVar167 * auVar86._8_4_,
                                                         CONCAT44(fVar166 * auVar86._4_4_,
                                                                  fVar150 * auVar86._0_4_)))),
                             auVar82,ZEXT1632(auVar9));
    auVar75 = vfmadd231ps_fma(auVar27,auVar82,ZEXT1632(auVar75));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar9._12_4_,
                                                 CONCAT48(fVar167 * auVar9._8_4_,
                                                          CONCAT44(fVar166 * auVar9._4_4_,
                                                                   fVar150 * auVar9._0_4_)))),
                              auVar82,ZEXT1632(auVar300));
    auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar75._12_4_,
                                                  CONCAT48(fVar167 * auVar75._8_4_,
                                                           CONCAT44(fVar166 * auVar75._4_4_,
                                                                    fVar150 * auVar75._0_4_)))),
                               ZEXT1632(auVar8),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar300));
    auVar84 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar8));
    fVar150 = fVar102 * auVar82._0_4_ * 3.0;
    fVar166 = fVar102 * auVar82._4_4_ * 3.0;
    auVar28._4_4_ = fVar166;
    auVar28._0_4_ = fVar150;
    fVar167 = fVar102 * auVar82._8_4_ * 3.0;
    auVar28._8_4_ = fVar167;
    fVar168 = fVar102 * auVar82._12_4_ * 3.0;
    auVar28._12_4_ = fVar168;
    fVar269 = fVar102 * auVar82._16_4_ * 3.0;
    auVar28._16_4_ = fVar269;
    fVar282 = fVar102 * auVar82._20_4_ * 3.0;
    auVar28._20_4_ = fVar282;
    fVar283 = fVar102 * auVar82._24_4_ * 3.0;
    auVar28._24_4_ = fVar283;
    auVar28._28_4_ = 0x40400000;
    auVar212._0_4_ = fVar102 * auVar84._0_4_ * 3.0;
    auVar212._4_4_ = fVar102 * auVar84._4_4_ * 3.0;
    auVar212._8_4_ = fVar102 * auVar84._8_4_ * 3.0;
    auVar212._12_4_ = fVar102 * auVar84._12_4_ * 3.0;
    auVar212._16_4_ = fVar102 * auVar84._16_4_ * 3.0;
    auVar212._20_4_ = fVar102 * auVar84._20_4_ * 3.0;
    auVar212._24_4_ = fVar102 * auVar84._24_4_ * 3.0;
    auVar212._28_4_ = 0;
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar86));
    local_1c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar110));
    auVar82 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar222));
    auVar84 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar215));
    auVar13 = vsubps_avx(auVar16,local_4e0);
    fVar170 = auVar82._0_4_ + auVar13._0_4_;
    fVar191 = auVar82._4_4_ + auVar13._4_4_;
    fVar193 = auVar82._8_4_ + auVar13._8_4_;
    fVar195 = auVar82._12_4_ + auVar13._12_4_;
    fVar196 = auVar82._16_4_ + auVar13._16_4_;
    fVar197 = auVar82._20_4_ + auVar13._20_4_;
    fVar198 = auVar82._24_4_ + auVar13._24_4_;
    auVar14 = vsubps_avx(local_1c0,auVar15);
    auVar294._0_4_ = auVar84._0_4_ + auVar14._0_4_;
    auVar294._4_4_ = auVar84._4_4_ + auVar14._4_4_;
    auVar294._8_4_ = auVar84._8_4_ + auVar14._8_4_;
    auVar294._12_4_ = auVar84._12_4_ + auVar14._12_4_;
    auVar294._16_4_ = auVar84._16_4_ + auVar14._16_4_;
    auVar294._20_4_ = auVar84._20_4_ + auVar14._20_4_;
    auVar294._24_4_ = auVar84._24_4_ + auVar14._24_4_;
    auVar294._28_4_ = auVar84._28_4_ + auVar14._28_4_;
    fVar102 = auVar215._0_4_;
    local_2a0 = fVar102 + (float)local_6a0._0_4_;
    fVar103 = auVar215._4_4_;
    fStack_29c = fVar103 + (float)local_6a0._4_4_;
    fVar171 = auVar215._8_4_;
    fStack_298 = fVar171 + fStack_698;
    fVar133 = auVar215._12_4_;
    fStack_294 = fVar133 + fStack_694;
    fStack_290 = fStack_690 + 0.0;
    fStack_28c = fStack_68c + 0.0;
    fStack_288 = fStack_688 + 0.0;
    fStack_284 = auVar83._28_4_ + 0.0;
    local_1e0 = ZEXT1632(auVar222);
    auVar84 = vsubps_avx(local_1e0,auVar19);
    local_220 = vpermps_avx2(_DAT_0205d4a0,auVar84);
    local_200 = ZEXT1632(auVar215);
    auVar84 = vsubps_avx(local_200,_local_6a0);
    local_2c0 = vpermps_avx2(_DAT_0205d4a0,auVar84);
    local_240._0_4_ = auVar86._0_4_ + fVar150;
    local_240._4_4_ = auVar86._4_4_ + fVar166;
    local_240._8_4_ = auVar86._8_4_ + fVar167;
    local_240._12_4_ = auVar86._12_4_ + fVar168;
    local_240._16_4_ = fVar269 + 0.0;
    local_240._20_4_ = fVar282 + 0.0;
    local_240._24_4_ = fVar283 + 0.0;
    local_240._28_4_ = 0x40400000;
    auVar281 = ZEXT1632(auVar86);
    auVar84 = vsubps_avx(auVar281,auVar28);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar84);
    fVar150 = auVar110._0_4_;
    local_280._0_4_ = fVar150 + auVar212._0_4_;
    fVar166 = auVar110._4_4_;
    local_280._4_4_ = fVar166 + auVar212._4_4_;
    fVar167 = auVar110._8_4_;
    local_280._8_4_ = fVar167 + auVar212._8_4_;
    fVar168 = auVar110._12_4_;
    local_280._12_4_ = fVar168 + auVar212._12_4_;
    local_280._16_4_ = auVar212._16_4_ + 0.0;
    local_280._20_4_ = auVar212._20_4_ + 0.0;
    local_280._24_4_ = auVar212._24_4_ + 0.0;
    local_280._28_4_ = 0;
    auVar84 = vsubps_avx(ZEXT1632(auVar110),auVar212);
    local_260 = vpermps_avx2(_DAT_0205d4a0,auVar84);
    auVar29._4_4_ = fVar103 * fVar191;
    auVar29._0_4_ = fVar102 * fVar170;
    auVar29._8_4_ = fVar171 * fVar193;
    auVar29._12_4_ = fVar133 * fVar195;
    auVar29._16_4_ = fVar196 * 0.0;
    auVar29._20_4_ = fVar197 * 0.0;
    auVar29._24_4_ = fVar198 * 0.0;
    auVar29._28_4_ = auVar84._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar29,local_1e0,auVar294);
    auVar30._4_4_ = fStack_29c * fVar191;
    auVar30._0_4_ = local_2a0 * fVar170;
    auVar30._8_4_ = fStack_298 * fVar193;
    auVar30._12_4_ = fStack_294 * fVar195;
    auVar30._16_4_ = fStack_290 * fVar196;
    auVar30._20_4_ = fStack_28c * fVar197;
    auVar30._24_4_ = fStack_288 * fVar198;
    auVar30._28_4_ = auVar17._28_4_;
    auVar50._4_4_ = fVar255;
    auVar50._0_4_ = fVar284;
    auVar50._8_4_ = fVar256;
    auVar50._12_4_ = fVar257;
    auVar50._16_4_ = fVar258;
    auVar50._20_4_ = fVar259;
    auVar50._24_4_ = fVar260;
    auVar50._28_4_ = 0x40400000;
    auVar9 = vfnmadd231ps_fma(auVar30,auVar294,auVar50);
    auVar31._4_4_ = local_2c0._4_4_ * fVar191;
    auVar31._0_4_ = local_2c0._0_4_ * fVar170;
    auVar31._8_4_ = local_2c0._8_4_ * fVar193;
    auVar31._12_4_ = local_2c0._12_4_ * fVar195;
    auVar31._16_4_ = local_2c0._16_4_ * fVar196;
    auVar31._20_4_ = local_2c0._20_4_ * fVar197;
    auVar31._24_4_ = local_2c0._24_4_ * fVar198;
    auVar31._28_4_ = fStack_284;
    auVar300 = vfnmadd231ps_fma(auVar31,local_220,auVar294);
    local_700._0_4_ = auVar15._0_4_;
    local_700._4_4_ = auVar15._4_4_;
    uStack_6f8._0_4_ = auVar15._8_4_;
    uStack_6f8._4_4_ = auVar15._12_4_;
    uStack_6f0._0_4_ = auVar15._16_4_;
    uStack_6f0._4_4_ = auVar15._20_4_;
    uStack_6e8._0_4_ = auVar15._24_4_;
    auVar32._4_4_ = fVar191 * (float)local_700._4_4_;
    auVar32._0_4_ = fVar170 * (float)local_700._0_4_;
    auVar32._8_4_ = fVar193 * (float)uStack_6f8;
    auVar32._12_4_ = fVar195 * uStack_6f8._4_4_;
    auVar32._16_4_ = fVar196 * (float)uStack_6f0;
    auVar32._20_4_ = fVar197 * uStack_6f0._4_4_;
    auVar32._24_4_ = fVar198 * (float)uStack_6e8;
    auVar32._28_4_ = local_2c0._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar32,local_4e0,auVar294);
    auVar56._4_4_ = fVar166 * fVar191;
    auVar56._0_4_ = fVar150 * fVar170;
    auVar56._8_4_ = fVar167 * fVar193;
    auVar56._12_4_ = fVar168 * fVar195;
    auVar56._16_4_ = fVar196 * 0.0;
    auVar56._20_4_ = fVar197 * 0.0;
    auVar56._24_4_ = fVar198 * 0.0;
    auVar56._28_4_ = DAT_0205d4a0._28_4_;
    auVar86 = vfnmadd231ps_fma(auVar56,auVar281,auVar294);
    auVar33._4_4_ = local_280._4_4_ * fVar191;
    auVar33._0_4_ = local_280._0_4_ * fVar170;
    auVar33._8_4_ = local_280._8_4_ * fVar193;
    auVar33._12_4_ = local_280._12_4_ * fVar195;
    auVar33._16_4_ = local_280._16_4_ * fVar196;
    auVar33._20_4_ = local_280._20_4_ * fVar197;
    auVar33._24_4_ = local_280._24_4_ * fVar198;
    auVar33._28_4_ = local_4e0._28_4_;
    auVar151 = vfnmadd231ps_fma(auVar33,local_240,auVar294);
    auVar34._4_4_ = local_260._4_4_ * fVar191;
    auVar34._0_4_ = local_260._0_4_ * fVar170;
    auVar34._8_4_ = local_260._8_4_ * fVar193;
    auVar34._12_4_ = local_260._12_4_ * fVar195;
    auVar34._16_4_ = local_260._16_4_ * fVar196;
    auVar34._20_4_ = local_260._20_4_ * fVar197;
    auVar34._24_4_ = local_260._24_4_ * fVar198;
    auVar34._28_4_ = local_220._28_4_;
    auVar222 = vfnmadd231ps_fma(auVar34,auVar294,auVar17);
    auVar35._4_4_ = local_1c0._4_4_ * fVar191;
    auVar35._0_4_ = local_1c0._0_4_ * fVar170;
    auVar35._8_4_ = local_1c0._8_4_ * fVar193;
    auVar35._12_4_ = local_1c0._12_4_ * fVar195;
    auVar35._16_4_ = local_1c0._16_4_ * fVar196;
    auVar35._20_4_ = local_1c0._20_4_ * fVar197;
    auVar35._24_4_ = local_1c0._24_4_ * fVar198;
    auVar35._28_4_ = auVar82._28_4_ + auVar13._28_4_;
    auVar215 = vfnmadd231ps_fma(auVar35,auVar294,auVar16);
    auVar84 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar82 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar83 = vminps_avx(ZEXT1632(auVar300),ZEXT1632(auVar75));
    auVar83 = vminps_avx(auVar84,auVar83);
    auVar84 = vmaxps_avx(ZEXT1632(auVar300),ZEXT1632(auVar75));
    auVar82 = vmaxps_avx(auVar82,auVar84);
    auVar13 = vminps_avx(ZEXT1632(auVar86),ZEXT1632(auVar151));
    auVar84 = vmaxps_avx(ZEXT1632(auVar86),ZEXT1632(auVar151));
    auVar14 = vminps_avx(ZEXT1632(auVar222),ZEXT1632(auVar215));
    auVar13 = vminps_avx(auVar13,auVar14);
    auVar13 = vminps_avx(auVar83,auVar13);
    auVar83 = vmaxps_avx(ZEXT1632(auVar222),ZEXT1632(auVar215));
    auVar84 = vmaxps_avx(auVar84,auVar83);
    auVar84 = vmaxps_avx(auVar82,auVar84);
    auVar55._4_4_ = fStack_2dc;
    auVar55._0_4_ = local_2e0;
    auVar55._8_4_ = fStack_2d8;
    auVar55._12_4_ = fStack_2d4;
    auVar55._16_4_ = fStack_2d0;
    auVar55._20_4_ = fStack_2cc;
    auVar55._24_4_ = fStack_2c8;
    auVar55._28_4_ = fStack_2c4;
    auVar82 = vcmpps_avx(auVar13,auVar55,2);
    auVar54._4_4_ = fStack_2fc;
    auVar54._0_4_ = local_300;
    auVar54._8_4_ = fStack_2f8;
    auVar54._12_4_ = fStack_2f4;
    auVar54._16_4_ = fStack_2f0;
    auVar54._20_4_ = fStack_2ec;
    auVar54._24_4_ = fStack_2e8;
    auVar54._28_4_ = fStack_2e4;
    auVar84 = vcmpps_avx(auVar84,auVar54,5);
    auVar82 = vandps_avx(auVar84,auVar82);
    auVar84 = local_3a0 & auVar82;
    uVar59 = 0;
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar84 >> 0x7f,0) != '\0') ||
          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar84 >> 0xbf,0) != '\0') ||
        (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar84[0x1f] < '\0')
    {
      auVar84 = vsubps_avx(local_4e0,local_1e0);
      auVar83 = vsubps_avx(auVar16,auVar281);
      fVar282 = auVar84._0_4_ + auVar83._0_4_;
      fVar283 = auVar84._4_4_ + auVar83._4_4_;
      fVar170 = auVar84._8_4_ + auVar83._8_4_;
      fVar191 = auVar84._12_4_ + auVar83._12_4_;
      fVar193 = auVar84._16_4_ + auVar83._16_4_;
      fVar195 = auVar84._20_4_ + auVar83._20_4_;
      fVar196 = auVar84._24_4_ + auVar83._24_4_;
      auVar13 = vsubps_avx(auVar15,local_200);
      auVar14 = vsubps_avx(local_1c0,ZEXT1632(auVar110));
      auVar101._0_4_ = auVar13._0_4_ + auVar14._0_4_;
      auVar101._4_4_ = auVar13._4_4_ + auVar14._4_4_;
      auVar101._8_4_ = auVar13._8_4_ + auVar14._8_4_;
      auVar101._12_4_ = auVar13._12_4_ + auVar14._12_4_;
      auVar101._16_4_ = auVar13._16_4_ + auVar14._16_4_;
      auVar101._20_4_ = auVar13._20_4_ + auVar14._20_4_;
      auVar101._24_4_ = auVar13._24_4_ + auVar14._24_4_;
      fVar269 = auVar14._28_4_;
      auVar101._28_4_ = auVar13._28_4_ + fVar269;
      auVar304._0_4_ = fVar102 * fVar282;
      auVar304._4_4_ = fVar103 * fVar283;
      auVar304._8_4_ = fVar171 * fVar170;
      auVar304._12_4_ = fVar133 * fVar191;
      auVar304._16_4_ = fVar193 * 0.0;
      auVar304._20_4_ = fVar195 * 0.0;
      auVar304._24_4_ = fVar196 * 0.0;
      auVar304._28_4_ = 0;
      auVar86 = vfnmadd231ps_fma(auVar304,auVar101,local_1e0);
      auVar36._4_4_ = fVar283 * fStack_29c;
      auVar36._0_4_ = fVar282 * local_2a0;
      auVar36._8_4_ = fVar170 * fStack_298;
      auVar36._12_4_ = fVar191 * fStack_294;
      auVar36._16_4_ = fVar193 * fStack_290;
      auVar36._20_4_ = fVar195 * fStack_28c;
      auVar36._24_4_ = fVar196 * fStack_288;
      auVar36._28_4_ = fVar269;
      auVar51._4_4_ = fVar255;
      auVar51._0_4_ = fVar284;
      auVar51._8_4_ = fVar256;
      auVar51._12_4_ = fVar257;
      auVar51._16_4_ = fVar258;
      auVar51._20_4_ = fVar259;
      auVar51._24_4_ = fVar260;
      auVar51._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar51,auVar101,auVar36);
      auVar37._4_4_ = fVar283 * local_2c0._4_4_;
      auVar37._0_4_ = fVar282 * local_2c0._0_4_;
      auVar37._8_4_ = fVar170 * local_2c0._8_4_;
      auVar37._12_4_ = fVar191 * local_2c0._12_4_;
      auVar37._16_4_ = fVar193 * local_2c0._16_4_;
      auVar37._20_4_ = fVar195 * local_2c0._20_4_;
      auVar37._24_4_ = fVar196 * local_2c0._24_4_;
      auVar37._28_4_ = fVar269;
      auVar9 = vfnmadd213ps_fma(local_220,auVar101,auVar37);
      auVar38._4_4_ = (float)local_700._4_4_ * fVar283;
      auVar38._0_4_ = (float)local_700._0_4_ * fVar282;
      auVar38._8_4_ = (float)uStack_6f8 * fVar170;
      auVar38._12_4_ = uStack_6f8._4_4_ * fVar191;
      auVar38._16_4_ = (float)uStack_6f0 * fVar193;
      auVar38._20_4_ = uStack_6f0._4_4_ * fVar195;
      auVar38._24_4_ = (float)uStack_6e8 * fVar196;
      auVar38._28_4_ = fVar269;
      auVar110 = vfnmadd231ps_fma(auVar38,auVar101,local_4e0);
      auVar115._0_4_ = fVar150 * fVar282;
      auVar115._4_4_ = fVar166 * fVar283;
      auVar115._8_4_ = fVar167 * fVar170;
      auVar115._12_4_ = fVar168 * fVar191;
      auVar115._16_4_ = fVar193 * 0.0;
      auVar115._20_4_ = fVar195 * 0.0;
      auVar115._24_4_ = fVar196 * 0.0;
      auVar115._28_4_ = 0;
      auVar151 = vfnmadd231ps_fma(auVar115,auVar101,auVar281);
      auVar39._4_4_ = fVar283 * local_280._4_4_;
      auVar39._0_4_ = fVar282 * local_280._0_4_;
      auVar39._8_4_ = fVar170 * local_280._8_4_;
      auVar39._12_4_ = fVar191 * local_280._12_4_;
      auVar39._16_4_ = fVar193 * local_280._16_4_;
      auVar39._20_4_ = fVar195 * local_280._20_4_;
      auVar39._24_4_ = fVar196 * local_280._24_4_;
      auVar39._28_4_ = auVar15._28_4_;
      auVar300 = vfnmadd213ps_fma(local_240,auVar101,auVar39);
      auVar40._4_4_ = fVar283 * local_260._4_4_;
      auVar40._0_4_ = fVar282 * local_260._0_4_;
      auVar40._8_4_ = fVar170 * local_260._8_4_;
      auVar40._12_4_ = fVar191 * local_260._12_4_;
      auVar40._16_4_ = fVar193 * local_260._16_4_;
      auVar40._20_4_ = fVar195 * local_260._20_4_;
      auVar40._24_4_ = fVar196 * local_260._24_4_;
      auVar40._28_4_ = auVar15._28_4_;
      auVar75 = vfnmadd213ps_fma(auVar17,auVar101,auVar40);
      auVar41._4_4_ = local_1c0._4_4_ * fVar283;
      auVar41._0_4_ = local_1c0._0_4_ * fVar282;
      auVar41._8_4_ = local_1c0._8_4_ * fVar170;
      auVar41._12_4_ = local_1c0._12_4_ * fVar191;
      auVar41._16_4_ = local_1c0._16_4_ * fVar193;
      auVar41._20_4_ = local_1c0._20_4_ * fVar195;
      auVar41._24_4_ = local_1c0._24_4_ * fVar196;
      auVar41._28_4_ = auVar84._28_4_ + auVar83._28_4_;
      auVar222 = vfnmadd231ps_fma(auVar41,auVar101,auVar16);
      auVar83 = vminps_avx(ZEXT1632(auVar86),ZEXT1632(auVar8));
      auVar84 = vmaxps_avx(ZEXT1632(auVar86),ZEXT1632(auVar8));
      auVar13 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar110));
      auVar13 = vminps_avx(auVar83,auVar13);
      auVar83 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar110));
      auVar84 = vmaxps_avx(auVar84,auVar83);
      auVar14 = vminps_avx(ZEXT1632(auVar151),ZEXT1632(auVar300));
      auVar83 = vmaxps_avx(ZEXT1632(auVar151),ZEXT1632(auVar300));
      auVar15 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar222));
      auVar14 = vminps_avx(auVar14,auVar15);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar222));
      auVar83 = vmaxps_avx(auVar83,auVar13);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar84 = vcmpps_avx(auVar14,auVar55,2);
      auVar83 = vcmpps_avx(auVar83,auVar54,5);
      auVar84 = vandps_avx(auVar83,auVar84);
      auVar82 = vandps_avx(auVar82,local_3a0);
      auVar83 = auVar82 & auVar84;
      if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar83 >> 0x7f,0) != '\0') ||
            (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar83 >> 0xbf,0) != '\0') ||
          (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar83[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar84,auVar82);
        uVar59 = vmovmskps_avx(auVar82);
      }
    }
    if (uVar59 != 0) {
      auStack_520[uVar61] = uVar59;
      uVar172 = vmovlps_avx(local_450);
      *(undefined8 *)(&uStack_380 + uVar61 * 2) = uVar172;
      uVar66 = vmovlps_avx(auVar296);
      auStack_1a0[uVar61] = uVar66;
      uVar61 = (ulong)((int)uVar61 + 1);
    }
    do {
      if ((int)uVar61 == 0) {
        if (bVar68) {
          return local_771;
        }
        uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar81._4_4_ = uVar71;
        auVar81._0_4_ = uVar71;
        auVar81._8_4_ = uVar71;
        auVar81._12_4_ = uVar71;
        auVar8 = vcmpps_avx(local_460,auVar81,2);
        uVar57 = vmovmskps_avx(auVar8);
        uVar57 = (uint)uVar67 & uVar57;
        local_771 = uVar57 != 0;
        if (!local_771) {
          return local_771;
        }
        goto LAB_016dba96;
      }
      uVar60 = (int)uVar61 - 1;
      uVar62 = (ulong)uVar60;
      uVar65 = auStack_520[uVar62];
      uVar59 = (&uStack_380)[uVar62 * 2];
      fVar150 = afStack_37c[uVar62 * 2];
      iVar58 = 0;
      for (uVar66 = (ulong)uVar65; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        iVar58 = iVar58 + 1;
      }
      uVar65 = uVar65 - 1 & uVar65;
      if (uVar65 == 0) {
        uVar61 = (ulong)uVar60;
      }
      local_770._8_8_ = 0;
      local_770._0_8_ = auStack_1a0[uVar62];
      auVar311 = ZEXT1664(local_770);
      auStack_520[uVar62] = uVar65;
      fVar166 = (float)(iVar58 + 1) * 0.14285715;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * (float)iVar58 * 0.14285715)),ZEXT416(uVar59)
                               ,ZEXT416((uint)(1.0 - (float)iVar58 * 0.14285715)));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar166)),ZEXT416(uVar59),
                               ZEXT416((uint)(1.0 - fVar166)));
      fVar166 = auVar9._0_4_;
      fVar167 = auVar8._0_4_;
      fVar150 = fVar166 - fVar167;
      if (0.16666667 <= fVar150) break;
      auVar300 = vshufps_avx(local_770,local_770,0x50);
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = &DAT_3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      auVar75 = vsubps_avx(auVar107,auVar300);
      fVar168 = auVar300._0_4_;
      auVar123._0_4_ = fVar168 * fVar148;
      fVar102 = auVar300._4_4_;
      auVar123._4_4_ = fVar102 * fVar149;
      fVar103 = auVar300._8_4_;
      auVar123._8_4_ = fVar103 * fVar148;
      fVar171 = auVar300._12_4_;
      auVar123._12_4_ = fVar171 * fVar149;
      auVar137._0_4_ = fVar168 * fVar199;
      auVar137._4_4_ = fVar102 * fVar213;
      auVar137._8_4_ = fVar103 * fVar199;
      auVar137._12_4_ = fVar171 * fVar213;
      auVar158._0_4_ = fVar168 * fVar214;
      auVar158._4_4_ = fVar102 * fVar233;
      auVar158._8_4_ = fVar103 * fVar214;
      auVar158._12_4_ = fVar171 * fVar233;
      auVar93._0_4_ = fVar168 * fVar234;
      auVar93._4_4_ = fVar102 * fVar246;
      auVar93._8_4_ = fVar103 * fVar234;
      auVar93._12_4_ = fVar171 * fVar246;
      auVar300 = vfmadd231ps_fma(auVar123,auVar75,auVar286);
      auVar86 = vfmadd231ps_fma(auVar137,auVar75,auVar249);
      auVar110 = vfmadd231ps_fma(auVar158,auVar75,auVar272);
      auVar75 = vfmadd231ps_fma(auVar93,auVar75,auVar136);
      auVar116._16_16_ = auVar300;
      auVar116._0_16_ = auVar300;
      auVar131._16_16_ = auVar86;
      auVar131._0_16_ = auVar86;
      auVar147._16_16_ = auVar110;
      auVar147._0_16_ = auVar110;
      auVar189._4_4_ = fVar167;
      auVar189._0_4_ = fVar167;
      auVar189._8_4_ = fVar167;
      auVar189._12_4_ = fVar167;
      auVar189._20_4_ = fVar166;
      auVar189._16_4_ = fVar166;
      auVar189._24_4_ = fVar166;
      auVar189._28_4_ = fVar166;
      auVar82 = vsubps_avx(auVar131,auVar116);
      auVar86 = vfmadd213ps_fma(auVar82,auVar189,auVar116);
      auVar82 = vsubps_avx(auVar147,auVar131);
      auVar151 = vfmadd213ps_fma(auVar82,auVar189,auVar131);
      auVar300 = vsubps_avx(auVar75,auVar110);
      auVar132._16_16_ = auVar300;
      auVar132._0_16_ = auVar300;
      auVar300 = vfmadd213ps_fma(auVar132,auVar189,auVar147);
      auVar82 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar86));
      auVar75 = vfmadd213ps_fma(auVar82,auVar189,ZEXT1632(auVar86));
      auVar82 = vsubps_avx(ZEXT1632(auVar300),ZEXT1632(auVar151));
      auVar300 = vfmadd213ps_fma(auVar82,auVar189,ZEXT1632(auVar151));
      auVar82 = vsubps_avx(ZEXT1632(auVar300),ZEXT1632(auVar75));
      auVar216 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar82,auVar189);
      fVar269 = auVar82._4_4_ * 3.0;
      fVar133 = fVar150 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar216._4_4_ + fVar133 * fVar269,
                    auVar216._0_4_ + fVar133 * auVar82._0_4_ * 3.0);
      local_4e0._8_4_ = auVar216._8_4_ + fVar133 * auVar82._8_4_ * 3.0;
      local_4e0._12_4_ = auVar216._12_4_ + fVar133 * auVar82._12_4_ * 3.0;
      auVar75 = vshufpd_avx(auVar216,auVar216,3);
      auVar86 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar300 = vsubps_avx(auVar75,auVar216);
      auVar110 = vsubps_avx(auVar86,(undefined1  [16])0x0);
      auVar108._0_4_ = auVar300._0_4_ + auVar110._0_4_;
      auVar108._4_4_ = auVar300._4_4_ + auVar110._4_4_;
      auVar108._8_4_ = auVar300._8_4_ + auVar110._8_4_;
      auVar108._12_4_ = auVar300._12_4_ + auVar110._12_4_;
      auVar300 = vshufps_avx(auVar216,auVar216,0xb1);
      auVar110 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar287._4_4_ = auVar108._0_4_;
      auVar287._0_4_ = auVar108._0_4_;
      auVar287._8_4_ = auVar108._0_4_;
      auVar287._12_4_ = auVar108._0_4_;
      auVar151 = vshufps_avx(auVar108,auVar108,0x55);
      fVar168 = auVar151._0_4_;
      auVar204._0_4_ = auVar300._0_4_ * fVar168;
      fVar102 = auVar151._4_4_;
      auVar204._4_4_ = auVar300._4_4_ * fVar102;
      fVar103 = auVar151._8_4_;
      auVar204._8_4_ = auVar300._8_4_ * fVar103;
      fVar171 = auVar151._12_4_;
      auVar204._12_4_ = auVar300._12_4_ * fVar171;
      auVar220._0_4_ = auVar110._0_4_ * fVar168;
      auVar220._4_4_ = auVar110._4_4_ * fVar102;
      auVar220._8_4_ = auVar110._8_4_ * fVar103;
      auVar220._12_4_ = auVar110._12_4_ * fVar171;
      auVar222 = vfmadd231ps_fma(auVar204,auVar287,auVar216);
      auVar215 = vfmadd231ps_fma(auVar220,auVar287,local_4e0._0_16_);
      auVar110 = vshufps_avx(auVar222,auVar222,0xe8);
      auVar151 = vshufps_avx(auVar215,auVar215,0xe8);
      auVar300 = vcmpps_avx(auVar110,auVar151,1);
      uVar59 = vextractps_avx(auVar300,0);
      auVar235 = auVar215;
      if ((uVar59 & 1) == 0) {
        auVar235 = auVar222;
      }
      auVar138._0_4_ = fVar133 * auVar82._16_4_ * 3.0;
      auVar138._4_4_ = fVar133 * fVar269;
      auVar138._8_4_ = fVar133 * auVar82._24_4_ * 3.0;
      auVar138._12_4_ = fVar133 * fVar166;
      auVar296 = vsubps_avx((undefined1  [16])0x0,auVar138);
      auVar139 = vshufps_avx(auVar296,auVar296,0xb1);
      auVar261 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar307._0_4_ = auVar139._0_4_ * fVar168;
      auVar307._4_4_ = auVar139._4_4_ * fVar102;
      auVar307._8_4_ = auVar139._8_4_ * fVar103;
      auVar307._12_4_ = auVar139._12_4_ * fVar171;
      auVar109._0_4_ = auVar261._0_4_ * fVar168;
      auVar109._4_4_ = auVar261._4_4_ * fVar102;
      auVar109._8_4_ = auVar261._8_4_ * fVar103;
      auVar109._12_4_ = auVar261._12_4_ * fVar171;
      auVar89 = vfmadd231ps_fma(auVar307,auVar287,auVar296);
      auVar18 = vfmadd231ps_fma(auVar109,(undefined1  [16])0x0,auVar287);
      auVar261 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar295 = vshufps_avx(auVar18,auVar18,0xe8);
      auVar139 = vcmpps_avx(auVar261,auVar295,1);
      uVar59 = vextractps_avx(auVar139,0);
      auVar240 = auVar18;
      if ((uVar59 & 1) == 0) {
        auVar240 = auVar89;
      }
      auVar235 = vmaxss_avx(auVar240,auVar235);
      auVar110 = vminps_avx(auVar110,auVar151);
      auVar151 = vminps_avx(auVar261,auVar295);
      auVar151 = vminps_avx(auVar110,auVar151);
      auVar300 = vshufps_avx(auVar300,auVar300,0x55);
      auVar300 = vblendps_avx(auVar300,auVar139,2);
      auVar139 = vpslld_avx(auVar300,0x1f);
      auVar300 = vshufpd_avx(auVar215,auVar215,1);
      auVar300 = vinsertps_avx(auVar300,auVar18,0x9c);
      auVar110 = vshufpd_avx(auVar222,auVar222,1);
      auVar110 = vinsertps_avx(auVar110,auVar89,0x9c);
      auVar300 = vblendvps_avx(auVar110,auVar300,auVar139);
      auVar110 = vmovshdup_avx(auVar300);
      auVar300 = vmaxss_avx(auVar110,auVar300);
      fVar103 = auVar151._0_4_;
      auVar110 = vmovshdup_avx(auVar151);
      fVar102 = auVar300._0_4_;
      fVar168 = auVar235._0_4_;
      if ((0.0001 <= fVar103) || (fVar102 <= -0.0001)) {
        auVar222 = vcmpps_avx(auVar110,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar215 = vcmpps_avx(auVar151,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar222 = vorps_avx(auVar215,auVar222);
        if ((-0.0001 < fVar168 & auVar222[0]) != 0) goto LAB_016dcb49;
        auVar222 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar300,5);
        auVar215 = vcmpps_avx(auVar110,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar222 = vorps_avx(auVar215,auVar222);
        if ((auVar222 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016dcb49;
        bVar42 = true;
LAB_016dd65e:
        auVar311 = ZEXT1664(local_770);
      }
      else {
LAB_016dcb49:
        auVar215 = vcmpps_avx(auVar151,_DAT_01feba10,1);
        auVar139 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar222 = vcmpss_avx(auVar235,ZEXT816(0) << 0x20,1);
        auVar159._8_4_ = 0x3f800000;
        auVar159._0_8_ = &DAT_3f8000003f800000;
        auVar159._12_4_ = 0x3f800000;
        auVar221._8_4_ = 0xbf800000;
        auVar221._0_8_ = 0xbf800000bf800000;
        auVar221._12_4_ = 0xbf800000;
        auVar222 = vblendvps_avx(auVar159,auVar221,auVar222);
        auVar215 = vblendvps_avx(auVar159,auVar221,auVar215);
        fVar171 = auVar215._0_4_;
        fVar133 = auVar222._0_4_;
        auVar222 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar261 = ZEXT816(0) << 0x20;
        if ((fVar171 == fVar133) && (!NAN(fVar171) && !NAN(fVar133))) {
          auVar222 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar171 == fVar133) && (!NAN(fVar171) && !NAN(fVar133))) {
          auVar139 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar215 = vmovshdup_avx(auVar215);
        fVar269 = auVar215._0_4_;
        if ((fVar171 != fVar269) || (NAN(fVar171) || NAN(fVar269))) {
          fVar171 = auVar110._0_4_;
          if ((fVar171 != fVar103) || (NAN(fVar171) || NAN(fVar103))) {
            auVar111._0_8_ = auVar151._0_8_ ^ 0x8000000080000000;
            auVar111._8_4_ = auVar151._8_4_ ^ 0x80000000;
            auVar111._12_4_ = auVar151._12_4_ ^ 0x80000000;
            auVar140._0_4_ = -fVar103 / (fVar171 - fVar103);
            auVar140._4_12_ = auVar111._4_12_;
            auVar110 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar140._0_4_)),auVar261,auVar140);
            auVar151 = auVar110;
          }
          else {
            auVar110 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar103 == 0.0) && (auVar110 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar103))) {
              auVar110 = ZEXT816(0);
            }
            auVar151 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar103 == 0.0) && (auVar151 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar103))) {
              auVar151 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar222 = vminss_avx(auVar222,auVar110);
          auVar139 = vmaxss_avx(auVar151,auVar139);
        }
        auVar300 = vcmpss_avx(auVar300,auVar261,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = &DAT_3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar160._8_4_ = 0xbf800000;
        auVar160._0_8_ = 0xbf800000bf800000;
        auVar160._12_4_ = 0xbf800000;
        auVar300 = vblendvps_avx(auVar141,auVar160,auVar300);
        fVar103 = auVar300._0_4_;
        auVar300 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar133 != fVar103) || (NAN(fVar133) || NAN(fVar103))) {
          if ((fVar102 != fVar168) || (NAN(fVar102) || NAN(fVar168))) {
            auVar112._0_8_ = auVar235._0_8_ ^ 0x8000000080000000;
            auVar112._8_4_ = auVar235._8_4_ ^ 0x80000000;
            auVar112._12_4_ = auVar235._12_4_ ^ 0x80000000;
            auVar142._0_4_ = -fVar168 / (fVar102 - fVar168);
            auVar142._4_12_ = auVar112._4_12_;
            auVar110 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar142._0_4_)),auVar261,auVar142);
            auVar151 = auVar110;
          }
          else {
            auVar110 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar168 == 0.0) && (auVar110 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar168))) {
              auVar110 = ZEXT816(0);
            }
            auVar151 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar168 == 0.0) && (auVar151 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar168))) {
              auVar151 = auVar300;
            }
          }
          auVar222 = vminss_avx(auVar222,auVar110);
          auVar139 = vmaxss_avx(auVar151,auVar139);
        }
        if ((fVar269 != fVar103) || (NAN(fVar269) || NAN(fVar103))) {
          auVar222 = vminss_avx(auVar222,auVar300);
          auVar139 = vmaxss_avx(auVar300,auVar139);
        }
        auVar110 = vmaxss_avx(auVar261,auVar222);
        auVar151 = vminss_avx(auVar139,auVar300);
        bVar42 = true;
        if (auVar151._0_4_ < auVar110._0_4_) goto LAB_016dd65e;
        auVar110 = vmaxss_avx(auVar261,ZEXT416((uint)(auVar110._0_4_ + -0.1)));
        auVar300 = vminss_avx(ZEXT416((uint)(auVar151._0_4_ + 0.1)),auVar300);
        auVar94._0_8_ = auVar216._0_8_;
        auVar94._8_8_ = auVar94._0_8_;
        auVar223._8_8_ = local_4e0._0_8_;
        auVar223._0_8_ = local_4e0._0_8_;
        auVar241._8_8_ = auVar296._0_8_;
        auVar241._0_8_ = auVar296._0_8_;
        auVar151 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
        auVar222 = vshufpd_avx(auVar296,auVar296,3);
        auVar215 = vshufps_avx(auVar110,auVar300,0);
        auVar124._8_4_ = 0x3f800000;
        auVar124._0_8_ = &DAT_3f8000003f800000;
        auVar124._12_4_ = 0x3f800000;
        auVar216 = vsubps_avx(auVar124,auVar215);
        local_6a0._0_4_ = auVar75._0_4_;
        local_6a0._4_4_ = auVar75._4_4_;
        fStack_698 = auVar75._8_4_;
        fStack_694 = auVar75._12_4_;
        fVar168 = auVar215._0_4_;
        auVar125._0_4_ = fVar168 * (float)local_6a0._0_4_;
        fVar102 = auVar215._4_4_;
        auVar125._4_4_ = fVar102 * (float)local_6a0._4_4_;
        fVar103 = auVar215._8_4_;
        auVar125._8_4_ = fVar103 * fStack_698;
        fVar171 = auVar215._12_4_;
        auVar125._12_4_ = fVar171 * fStack_694;
        auVar143._0_4_ = auVar151._0_4_ * fVar168;
        auVar143._4_4_ = auVar151._4_4_ * fVar102;
        auVar143._8_4_ = auVar151._8_4_ * fVar103;
        auVar143._12_4_ = auVar151._12_4_ * fVar171;
        auVar161._0_4_ = auVar222._0_4_ * fVar168;
        auVar161._4_4_ = auVar222._4_4_ * fVar102;
        auVar161._8_4_ = auVar222._8_4_ * fVar103;
        auVar161._12_4_ = auVar222._12_4_ * fVar171;
        local_700._0_4_ = auVar86._0_4_;
        local_700._4_4_ = auVar86._4_4_;
        uStack_6f8._0_4_ = auVar86._8_4_;
        uStack_6f8._4_4_ = auVar86._12_4_;
        auVar184._0_4_ = fVar168 * (float)local_700._0_4_;
        auVar184._4_4_ = fVar102 * (float)local_700._4_4_;
        auVar184._8_4_ = fVar103 * (float)uStack_6f8;
        auVar184._12_4_ = fVar171 * uStack_6f8._4_4_;
        auVar151 = vfmadd231ps_fma(auVar125,auVar216,auVar94);
        auVar222 = vfmadd231ps_fma(auVar143,auVar216,auVar223);
        auVar215 = vfmadd231ps_fma(auVar161,auVar216,auVar241);
        auVar216 = vfmadd231ps_fma(auVar184,auVar216,ZEXT816(0));
        auVar75 = vmovshdup_avx(local_770);
        auVar261 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar110._0_4_)),local_770,
                                   ZEXT416((uint)(1.0 - auVar110._0_4_)));
        auVar295 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar300._0_4_)),local_770,
                                   ZEXT416((uint)(1.0 - auVar300._0_4_)));
        fVar168 = 1.0 / fVar150;
        auVar300 = vsubps_avx(auVar222,auVar151);
        auVar205._0_4_ = auVar300._0_4_ * 3.0;
        auVar205._4_4_ = auVar300._4_4_ * 3.0;
        auVar205._8_4_ = auVar300._8_4_ * 3.0;
        auVar205._12_4_ = auVar300._12_4_ * 3.0;
        auVar300 = vsubps_avx(auVar215,auVar222);
        auVar224._0_4_ = auVar300._0_4_ * 3.0;
        auVar224._4_4_ = auVar300._4_4_ * 3.0;
        auVar224._8_4_ = auVar300._8_4_ * 3.0;
        auVar224._12_4_ = auVar300._12_4_ * 3.0;
        auVar300 = vsubps_avx(auVar216,auVar215);
        auVar242._0_4_ = auVar300._0_4_ * 3.0;
        auVar242._4_4_ = auVar300._4_4_ * 3.0;
        auVar242._8_4_ = auVar300._8_4_ * 3.0;
        auVar242._12_4_ = auVar300._12_4_ * 3.0;
        auVar75 = vminps_avx(auVar224,auVar242);
        auVar300 = vmaxps_avx(auVar224,auVar242);
        auVar75 = vminps_avx(auVar205,auVar75);
        auVar300 = vmaxps_avx(auVar205,auVar300);
        auVar86 = vshufpd_avx(auVar75,auVar75,3);
        auVar110 = vshufpd_avx(auVar300,auVar300,3);
        auVar75 = vminps_avx(auVar75,auVar86);
        auVar300 = vmaxps_avx(auVar300,auVar110);
        auVar225._0_4_ = auVar75._0_4_ * fVar168;
        auVar225._4_4_ = auVar75._4_4_ * fVar168;
        auVar225._8_4_ = auVar75._8_4_ * fVar168;
        auVar225._12_4_ = auVar75._12_4_ * fVar168;
        auVar206._0_4_ = fVar168 * auVar300._0_4_;
        auVar206._4_4_ = fVar168 * auVar300._4_4_;
        auVar206._8_4_ = fVar168 * auVar300._8_4_;
        auVar206._12_4_ = fVar168 * auVar300._12_4_;
        fVar168 = 1.0 / (auVar295._0_4_ - auVar261._0_4_);
        auVar300 = vshufpd_avx(auVar151,auVar151,3);
        auVar75 = vshufpd_avx(auVar222,auVar222,3);
        auVar86 = vshufpd_avx(auVar215,auVar215,3);
        auVar110 = vshufpd_avx(auVar216,auVar216,3);
        auVar300 = vsubps_avx(auVar300,auVar151);
        auVar151 = vsubps_avx(auVar75,auVar222);
        auVar222 = vsubps_avx(auVar86,auVar215);
        auVar110 = vsubps_avx(auVar110,auVar216);
        auVar75 = vminps_avx(auVar300,auVar151);
        auVar300 = vmaxps_avx(auVar300,auVar151);
        auVar86 = vminps_avx(auVar222,auVar110);
        auVar86 = vminps_avx(auVar75,auVar86);
        auVar75 = vmaxps_avx(auVar222,auVar110);
        auVar300 = vmaxps_avx(auVar300,auVar75);
        auVar263._0_4_ = fVar168 * auVar86._0_4_;
        auVar263._4_4_ = fVar168 * auVar86._4_4_;
        auVar263._8_4_ = fVar168 * auVar86._8_4_;
        auVar263._12_4_ = fVar168 * auVar86._12_4_;
        auVar250._0_4_ = fVar168 * auVar300._0_4_;
        auVar250._4_4_ = fVar168 * auVar300._4_4_;
        auVar250._8_4_ = fVar168 * auVar300._8_4_;
        auVar250._12_4_ = fVar168 * auVar300._12_4_;
        auVar110 = vinsertps_avx(auVar8,auVar261,0x10);
        auVar151 = vinsertps_avx(auVar9,auVar295,0x10);
        auVar80._0_4_ = (auVar110._0_4_ + auVar151._0_4_) * 0.5;
        auVar80._4_4_ = (auVar110._4_4_ + auVar151._4_4_) * 0.5;
        auVar80._8_4_ = (auVar110._8_4_ + auVar151._8_4_) * 0.5;
        auVar80._12_4_ = (auVar110._12_4_ + auVar151._12_4_) * 0.5;
        auVar126._4_4_ = auVar80._0_4_;
        auVar126._0_4_ = auVar80._0_4_;
        auVar126._8_4_ = auVar80._0_4_;
        auVar126._12_4_ = auVar80._0_4_;
        auVar300 = vfmadd213ps_fma(local_3b0,auVar126,auVar10);
        auVar75 = vfmadd213ps_fma(local_3c0,auVar126,auVar11);
        auVar86 = vfmadd213ps_fma(local_3d0,auVar126,auVar12);
        auVar9 = vsubps_avx(auVar75,auVar300);
        auVar300 = vfmadd213ps_fma(auVar9,auVar126,auVar300);
        auVar9 = vsubps_avx(auVar86,auVar75);
        auVar9 = vfmadd213ps_fma(auVar9,auVar126,auVar75);
        auVar9 = vsubps_avx(auVar9,auVar300);
        auVar300 = vfmadd231ps_fma(auVar300,auVar9,auVar126);
        auVar127._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
        auVar127._8_4_ = auVar9._8_4_ * 3.0;
        auVar127._12_4_ = auVar9._12_4_ * 3.0;
        auVar243._8_8_ = auVar300._0_8_;
        auVar243._0_8_ = auVar300._0_8_;
        auVar9 = vshufpd_avx(auVar300,auVar300,3);
        auVar300 = vshufps_avx(auVar80,auVar80,0x55);
        auVar222 = vsubps_avx(auVar9,auVar243);
        auVar216 = vfmadd231ps_fma(auVar243,auVar300,auVar222);
        auVar288._8_8_ = auVar127._0_8_;
        auVar288._0_8_ = auVar127._0_8_;
        auVar9 = vshufpd_avx(auVar127,auVar127,3);
        auVar9 = vsubps_avx(auVar9,auVar288);
        auVar215 = vfmadd213ps_fma(auVar9,auVar300,auVar288);
        auVar300 = vmovshdup_avx(auVar215);
        auVar289._0_8_ = auVar300._0_8_ ^ 0x8000000080000000;
        auVar289._8_4_ = auVar300._8_4_ ^ 0x80000000;
        auVar289._12_4_ = auVar300._12_4_ ^ 0x80000000;
        auVar75 = vmovshdup_avx(auVar222);
        auVar9 = vunpcklps_avx(auVar75,auVar289);
        auVar86 = vshufps_avx(auVar9,auVar289,4);
        auVar308._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
        auVar308._8_4_ = auVar222._8_4_ ^ 0x80000000;
        auVar308._12_4_ = auVar222._12_4_ ^ 0x80000000;
        auVar9 = vmovlhps_avx(auVar308,auVar215);
        auVar9 = vshufps_avx(auVar9,auVar215,8);
        auVar300 = vfmsub231ss_fma(ZEXT416((uint)(auVar300._0_4_ * auVar222._0_4_)),auVar75,auVar215
                                  );
        auVar144._0_4_ = auVar300._0_4_;
        auVar144._4_4_ = auVar144._0_4_;
        auVar144._8_4_ = auVar144._0_4_;
        auVar144._12_4_ = auVar144._0_4_;
        auVar300 = vdivps_avx(auVar86,auVar144);
        auVar75 = vdivps_avx(auVar9,auVar144);
        fVar103 = auVar216._0_4_;
        fVar168 = auVar300._0_4_;
        auVar9 = vshufps_avx(auVar216,auVar216,0x55);
        fVar102 = auVar75._0_4_;
        local_700._4_4_ = fVar103 * auVar300._4_4_ + auVar9._4_4_ * auVar75._4_4_;
        local_700._0_4_ = fVar103 * fVar168 + auVar9._0_4_ * fVar102;
        uStack_6f8._0_4_ = fVar103 * auVar300._8_4_ + auVar9._8_4_ * auVar75._8_4_;
        uStack_6f8._4_4_ = fVar103 * auVar300._12_4_ + auVar9._12_4_ * auVar75._12_4_;
        auVar222 = vmovshdup_avx(auVar300);
        auVar9 = vinsertps_avx(auVar225,auVar263,0x1c);
        auVar301._0_4_ = auVar222._0_4_ * auVar9._0_4_;
        auVar301._4_4_ = auVar222._4_4_ * auVar9._4_4_;
        auVar301._8_4_ = auVar222._8_4_ * auVar9._8_4_;
        auVar301._12_4_ = auVar222._12_4_ * auVar9._12_4_;
        auVar86 = vinsertps_avx(auVar206,auVar250,0x1c);
        auVar273._0_4_ = auVar222._0_4_ * auVar86._0_4_;
        auVar273._4_4_ = auVar222._4_4_ * auVar86._4_4_;
        auVar273._8_4_ = auVar222._8_4_ * auVar86._8_4_;
        auVar273._12_4_ = auVar222._12_4_ * auVar86._12_4_;
        auVar235 = vminps_avx(auVar301,auVar273);
        auVar216 = vmaxps_avx(auVar273,auVar301);
        auVar222 = vinsertps_avx(auVar263,auVar225,0x4c);
        auVar139 = vmovshdup_avx(auVar75);
        auVar215 = vinsertps_avx(auVar250,auVar206,0x4c);
        auVar251._0_4_ = auVar139._0_4_ * auVar222._0_4_;
        auVar251._4_4_ = auVar139._4_4_ * auVar222._4_4_;
        auVar251._8_4_ = auVar139._8_4_ * auVar222._8_4_;
        auVar251._12_4_ = auVar139._12_4_ * auVar222._12_4_;
        auVar264._0_4_ = auVar139._0_4_ * auVar215._0_4_;
        auVar264._4_4_ = auVar139._4_4_ * auVar215._4_4_;
        auVar264._8_4_ = auVar139._8_4_ * auVar215._8_4_;
        auVar264._12_4_ = auVar139._12_4_ * auVar215._12_4_;
        auVar139 = vminps_avx(auVar251,auVar264);
        auVar95._0_4_ = auVar139._0_4_ + auVar235._0_4_;
        auVar95._4_4_ = auVar139._4_4_ + auVar235._4_4_;
        auVar95._8_4_ = auVar139._8_4_ + auVar235._8_4_;
        auVar95._12_4_ = auVar139._12_4_ + auVar235._12_4_;
        auVar235 = vmaxps_avx(auVar264,auVar251);
        auVar252._0_4_ = auVar216._0_4_ + auVar235._0_4_;
        auVar252._4_4_ = auVar216._4_4_ + auVar235._4_4_;
        auVar252._8_4_ = auVar216._8_4_ + auVar235._8_4_;
        auVar252._12_4_ = auVar216._12_4_ + auVar235._12_4_;
        auVar265._8_8_ = 0x3f80000000000000;
        auVar265._0_8_ = 0x3f80000000000000;
        auVar216 = vsubps_avx(auVar265,auVar252);
        auVar235 = vsubps_avx(auVar265,auVar95);
        auVar139 = vsubps_avx(auVar110,auVar80);
        auVar290._0_4_ = fVar168 * auVar9._0_4_;
        auVar290._4_4_ = fVar168 * auVar9._4_4_;
        auVar290._8_4_ = fVar168 * auVar9._8_4_;
        auVar290._12_4_ = fVar168 * auVar9._12_4_;
        auVar274._0_4_ = fVar168 * auVar86._0_4_;
        auVar274._4_4_ = fVar168 * auVar86._4_4_;
        auVar274._8_4_ = fVar168 * auVar86._8_4_;
        auVar274._12_4_ = fVar168 * auVar86._12_4_;
        auVar86 = vminps_avx(auVar290,auVar274);
        auVar9 = vmaxps_avx(auVar274,auVar290);
        auVar226._0_4_ = fVar102 * auVar222._0_4_;
        auVar226._4_4_ = fVar102 * auVar222._4_4_;
        auVar226._8_4_ = fVar102 * auVar222._8_4_;
        auVar226._12_4_ = fVar102 * auVar222._12_4_;
        auVar207._0_4_ = fVar102 * auVar215._0_4_;
        auVar207._4_4_ = fVar102 * auVar215._4_4_;
        auVar207._8_4_ = fVar102 * auVar215._8_4_;
        auVar207._12_4_ = fVar102 * auVar215._12_4_;
        auVar222 = vminps_avx(auVar226,auVar207);
        auVar291._0_4_ = auVar86._0_4_ + auVar222._0_4_;
        auVar291._4_4_ = auVar86._4_4_ + auVar222._4_4_;
        auVar291._8_4_ = auVar86._8_4_ + auVar222._8_4_;
        auVar291._12_4_ = auVar86._12_4_ + auVar222._12_4_;
        auVar222 = vsubps_avx(auVar151,auVar80);
        auVar86 = vmaxps_avx(auVar207,auVar226);
        fVar103 = auVar139._0_4_;
        auVar227._0_4_ = fVar103 * auVar216._0_4_;
        fVar171 = auVar139._4_4_;
        auVar227._4_4_ = fVar171 * auVar216._4_4_;
        fVar133 = auVar139._8_4_;
        auVar227._8_4_ = fVar133 * auVar216._8_4_;
        fVar269 = auVar139._12_4_;
        auVar227._12_4_ = fVar269 * auVar216._12_4_;
        auVar208._0_4_ = auVar9._0_4_ + auVar86._0_4_;
        auVar208._4_4_ = auVar9._4_4_ + auVar86._4_4_;
        auVar208._8_4_ = auVar9._8_4_ + auVar86._8_4_;
        auVar208._12_4_ = auVar9._12_4_ + auVar86._12_4_;
        auVar275._8_8_ = 0x3f800000;
        auVar275._0_8_ = 0x3f800000;
        auVar9 = vsubps_avx(auVar275,auVar208);
        auVar86 = vsubps_avx(auVar275,auVar291);
        auVar292._0_4_ = fVar103 * auVar235._0_4_;
        auVar292._4_4_ = fVar171 * auVar235._4_4_;
        auVar292._8_4_ = fVar133 * auVar235._8_4_;
        auVar292._12_4_ = fVar269 * auVar235._12_4_;
        fVar282 = auVar222._0_4_;
        auVar253._0_4_ = fVar282 * auVar216._0_4_;
        fVar283 = auVar222._4_4_;
        auVar253._4_4_ = fVar283 * auVar216._4_4_;
        fVar284 = auVar222._8_4_;
        auVar253._8_4_ = fVar284 * auVar216._8_4_;
        fVar170 = auVar222._12_4_;
        auVar253._12_4_ = fVar170 * auVar216._12_4_;
        auVar96._0_4_ = fVar282 * auVar235._0_4_;
        auVar96._4_4_ = fVar283 * auVar235._4_4_;
        auVar96._8_4_ = fVar284 * auVar235._8_4_;
        auVar96._12_4_ = fVar170 * auVar235._12_4_;
        auVar309._0_4_ = fVar103 * auVar9._0_4_;
        auVar309._4_4_ = fVar171 * auVar9._4_4_;
        auVar309._8_4_ = fVar133 * auVar9._8_4_;
        auVar309._12_4_ = fVar269 * auVar9._12_4_;
        auVar266._0_4_ = fVar103 * auVar86._0_4_;
        auVar266._4_4_ = fVar171 * auVar86._4_4_;
        auVar266._8_4_ = fVar133 * auVar86._8_4_;
        auVar266._12_4_ = fVar269 * auVar86._12_4_;
        auVar209._0_4_ = fVar282 * auVar9._0_4_;
        auVar209._4_4_ = fVar283 * auVar9._4_4_;
        auVar209._8_4_ = fVar284 * auVar9._8_4_;
        auVar209._12_4_ = fVar170 * auVar9._12_4_;
        auVar276._0_4_ = fVar282 * auVar86._0_4_;
        auVar276._4_4_ = fVar283 * auVar86._4_4_;
        auVar276._8_4_ = fVar284 * auVar86._8_4_;
        auVar276._12_4_ = fVar170 * auVar86._12_4_;
        auVar9 = vminps_avx(auVar309,auVar266);
        auVar86 = vminps_avx(auVar209,auVar276);
        auVar9 = vminps_avx(auVar9,auVar86);
        auVar86 = vmaxps_avx(auVar266,auVar309);
        auVar222 = vminps_avx(auVar227,auVar292);
        auVar215 = vminps_avx(auVar253,auVar96);
        auVar222 = vminps_avx(auVar222,auVar215);
        auVar9 = vhaddps_avx(auVar9,auVar222);
        auVar222 = vmaxps_avx(auVar276,auVar209);
        auVar86 = vmaxps_avx(auVar222,auVar86);
        auVar222 = vmaxps_avx(auVar292,auVar227);
        auVar215 = vmaxps_avx(auVar96,auVar253);
        auVar222 = vmaxps_avx(auVar215,auVar222);
        auVar86 = vhaddps_avx(auVar86,auVar222);
        auVar222 = vshufps_avx(auVar80,auVar80,0x54);
        auVar222 = vsubps_avx(auVar222,_local_700);
        auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
        auVar86 = vshufps_avx(auVar86,auVar86,0xe8);
        auVar228._0_4_ = auVar222._0_4_ + auVar9._0_4_;
        auVar228._4_4_ = auVar222._4_4_ + auVar9._4_4_;
        auVar228._8_4_ = auVar222._8_4_ + auVar9._8_4_;
        auVar228._12_4_ = auVar222._12_4_ + auVar9._12_4_;
        auVar210._0_4_ = auVar222._0_4_ + auVar86._0_4_;
        auVar210._4_4_ = auVar222._4_4_ + auVar86._4_4_;
        auVar210._8_4_ = auVar222._8_4_ + auVar86._8_4_;
        auVar210._12_4_ = auVar222._12_4_ + auVar86._12_4_;
        auVar9 = vmaxps_avx(auVar110,auVar228);
        auVar86 = vminps_avx(auVar210,auVar151);
        auVar9 = vcmpps_avx(auVar86,auVar9,1);
        auVar9 = vshufps_avx(auVar9,auVar9,0x50);
        local_770 = vinsertps_avx(auVar261,ZEXT416((uint)auVar295._0_4_),0x10);
        auVar311 = ZEXT1664(local_770);
        if ((auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar9[0xf]) {
          bVar64 = 0;
          if ((fVar167 < auVar228._0_4_) && (bVar64 = 0, auVar210._0_4_ < auVar151._0_4_)) {
            auVar86 = vmovshdup_avx(auVar228);
            auVar9 = vcmpps_avx(auVar210,auVar151,1);
            bVar64 = auVar9[4] & auVar261._0_4_ < auVar86._0_4_;
          }
          if (((3 < (uint)uVar61 || fVar150 < 0.001) | bVar64) == 1) {
            lVar63 = 200;
            do {
              fVar171 = auVar222._0_4_;
              fVar103 = 1.0 - fVar171;
              fVar150 = fVar103 * fVar103 * fVar103;
              fVar167 = fVar171 * 3.0 * fVar103 * fVar103;
              fVar103 = fVar103 * fVar171 * fVar171 * 3.0;
              auVar162._4_4_ = fVar150;
              auVar162._0_4_ = fVar150;
              auVar162._8_4_ = fVar150;
              auVar162._12_4_ = fVar150;
              auVar113._4_4_ = fVar167;
              auVar113._0_4_ = fVar167;
              auVar113._8_4_ = fVar167;
              auVar113._12_4_ = fVar167;
              auVar97._4_4_ = fVar103;
              auVar97._0_4_ = fVar103;
              auVar97._8_4_ = fVar103;
              auVar97._12_4_ = fVar103;
              fVar171 = fVar171 * fVar171 * fVar171;
              auVar185._0_4_ = (float)local_3e0._0_4_ * fVar171;
              auVar185._4_4_ = (float)local_3e0._4_4_ * fVar171;
              auVar185._8_4_ = fStack_3d8 * fVar171;
              auVar185._12_4_ = fStack_3d4 * fVar171;
              auVar9 = vfmadd231ps_fma(auVar185,auVar12,auVar97);
              auVar9 = vfmadd231ps_fma(auVar9,auVar11,auVar113);
              auVar9 = vfmadd231ps_fma(auVar9,auVar10,auVar162);
              auVar98._8_8_ = auVar9._0_8_;
              auVar98._0_8_ = auVar9._0_8_;
              auVar9 = vshufpd_avx(auVar9,auVar9,3);
              auVar86 = vshufps_avx(auVar222,auVar222,0x55);
              auVar9 = vsubps_avx(auVar9,auVar98);
              auVar86 = vfmadd213ps_fma(auVar9,auVar86,auVar98);
              fVar150 = auVar86._0_4_;
              auVar9 = vshufps_avx(auVar86,auVar86,0x55);
              auVar99._0_4_ = fVar168 * fVar150 + fVar102 * auVar9._0_4_;
              auVar99._4_4_ = auVar300._4_4_ * fVar150 + auVar75._4_4_ * auVar9._4_4_;
              auVar99._8_4_ = auVar300._8_4_ * fVar150 + auVar75._8_4_ * auVar9._8_4_;
              auVar99._12_4_ = auVar300._12_4_ * fVar150 + auVar75._12_4_ * auVar9._12_4_;
              auVar222 = vsubps_avx(auVar222,auVar99);
              auVar9 = vandps_avx(auVar200,auVar86);
              auVar86 = vshufps_avx(auVar9,auVar9,0xf5);
              auVar9 = vmaxss_avx(auVar86,auVar9);
              if (auVar9._0_4_ < fVar85) {
                local_120 = auVar222._0_4_;
                if (0.0 <= local_120) {
                  auVar311 = ZEXT1664(local_770);
                  if (local_120 <= 1.0) {
                    auVar9 = vmovshdup_avx(auVar222);
                    fVar150 = auVar9._0_4_;
                    if ((0.0 <= fVar150) && (fVar150 <= 1.0)) {
                      auVar300 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar235 = vinsertps_avx(auVar300,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar300 = vdpps_avx(auVar235,auVar73,0x7f);
                      auVar75 = vdpps_avx(auVar235,auVar88,0x7f);
                      auVar86 = vdpps_avx(auVar235,local_3f0,0x7f);
                      auVar110 = vdpps_avx(auVar235,local_400,0x7f);
                      auVar151 = vdpps_avx(auVar235,local_410,0x7f);
                      auVar215 = vdpps_avx(auVar235,local_420,0x7f);
                      auVar216 = vdpps_avx(auVar235,local_430,0x7f);
                      auVar235 = vdpps_avx(auVar235,local_440,0x7f);
                      fVar167 = 1.0 - fVar150;
                      auVar300 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * auVar151._0_4_)),
                                                 ZEXT416((uint)fVar167),auVar300);
                      auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar215._0_4_ * fVar150)),
                                                ZEXT416((uint)fVar167),auVar75);
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar216._0_4_ * fVar150)),
                                                ZEXT416((uint)fVar167),auVar86);
                      auVar110 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * auVar235._0_4_)),
                                                 ZEXT416((uint)fVar167),auVar110);
                      fVar102 = 1.0 - local_120;
                      fVar150 = fVar102 * local_120 * local_120 * 3.0;
                      fVar171 = local_120 * local_120 * local_120;
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * auVar110._0_4_)),
                                                ZEXT416((uint)fVar150),auVar86);
                      fVar167 = local_120 * 3.0 * fVar102 * fVar102;
                      auVar75 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar167),auVar75);
                      fVar168 = fVar102 * fVar102 * fVar102;
                      auVar300 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar168),auVar300);
                      fVar103 = auVar300._0_4_;
                      if ((fVar70 <= fVar103) &&
                         (fVar133 = *(float *)(ray + k * 4 + 0x100), fVar103 <= fVar133)) {
                        pGVar4 = (context->scene->geometries).items[uVar57].ptr;
                        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          bVar69 = false;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar69 = true, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                ) {
                          auVar300 = vshufps_avx(auVar222,auVar222,0x55);
                          auVar244._8_4_ = 0x3f800000;
                          auVar244._0_8_ = &DAT_3f8000003f800000;
                          auVar244._12_4_ = 0x3f800000;
                          auVar75 = vsubps_avx(auVar244,auVar300);
                          fVar269 = auVar300._0_4_;
                          auVar254._0_4_ = fVar269 * auVar248._0_4_;
                          fVar282 = auVar300._4_4_;
                          auVar254._4_4_ = fVar282 * auVar248._4_4_;
                          fVar283 = auVar300._8_4_;
                          auVar254._8_4_ = fVar283 * auVar248._8_4_;
                          fVar284 = auVar300._12_4_;
                          auVar254._12_4_ = fVar284 * auVar248._12_4_;
                          auVar267._0_4_ = fVar269 * auVar77._0_4_;
                          auVar267._4_4_ = fVar282 * auVar77._4_4_;
                          auVar267._8_4_ = fVar283 * auVar77._8_4_;
                          auVar267._12_4_ = fVar284 * auVar77._12_4_;
                          local_620 = auVar118._0_4_;
                          fStack_61c = auVar118._4_4_;
                          fStack_618 = auVar118._8_4_;
                          fStack_614 = auVar118._12_4_;
                          auVar277._0_4_ = fVar269 * local_620;
                          auVar277._4_4_ = fVar282 * fStack_61c;
                          auVar277._8_4_ = fVar283 * fStack_618;
                          auVar277._12_4_ = fVar284 * fStack_614;
                          auVar229._0_4_ = fVar269 * fVar169;
                          auVar229._4_4_ = fVar282 * fVar190;
                          auVar229._8_4_ = fVar283 * fVar192;
                          auVar229._12_4_ = fVar284 * fVar194;
                          auVar300 = vfmadd231ps_fma(auVar254,auVar75,auVar74);
                          auVar86 = vfmadd231ps_fma(auVar267,auVar75,auVar121);
                          auVar110 = vfmadd231ps_fma(auVar277,auVar75,auVar87);
                          auVar151 = vfmadd231ps_fma(auVar229,auVar75,auVar104);
                          auVar300 = vsubps_avx(auVar86,auVar300);
                          auVar75 = vsubps_avx(auVar110,auVar86);
                          auVar86 = vsubps_avx(auVar151,auVar110);
                          auVar278._0_4_ = local_120 * auVar75._0_4_;
                          auVar278._4_4_ = local_120 * auVar75._4_4_;
                          auVar278._8_4_ = local_120 * auVar75._8_4_;
                          auVar278._12_4_ = local_120 * auVar75._12_4_;
                          auVar211._4_4_ = fVar102;
                          auVar211._0_4_ = fVar102;
                          auVar211._8_4_ = fVar102;
                          auVar211._12_4_ = fVar102;
                          auVar300 = vfmadd231ps_fma(auVar278,auVar211,auVar300);
                          auVar230._0_4_ = local_120 * auVar86._0_4_;
                          auVar230._4_4_ = local_120 * auVar86._4_4_;
                          auVar230._8_4_ = local_120 * auVar86._8_4_;
                          auVar230._12_4_ = local_120 * auVar86._12_4_;
                          auVar75 = vfmadd231ps_fma(auVar230,auVar211,auVar75);
                          auVar231._0_4_ = local_120 * auVar75._0_4_;
                          auVar231._4_4_ = local_120 * auVar75._4_4_;
                          auVar231._8_4_ = local_120 * auVar75._8_4_;
                          auVar231._12_4_ = local_120 * auVar75._12_4_;
                          auVar75 = vfmadd231ps_fma(auVar231,auVar211,auVar300);
                          auVar186._0_4_ = fVar171 * (float)local_4a0._0_4_;
                          auVar186._4_4_ = fVar171 * (float)local_4a0._4_4_;
                          auVar186._8_4_ = fVar171 * fStack_498;
                          auVar186._12_4_ = fVar171 * fStack_494;
                          auVar128._4_4_ = fVar150;
                          auVar128._0_4_ = fVar150;
                          auVar128._8_4_ = fVar150;
                          auVar128._12_4_ = fVar150;
                          auVar300 = vfmadd132ps_fma(auVar128,auVar186,local_490);
                          auVar163._4_4_ = fVar167;
                          auVar163._0_4_ = fVar167;
                          auVar163._8_4_ = fVar167;
                          auVar163._12_4_ = fVar167;
                          auVar300 = vfmadd132ps_fma(auVar163,auVar300,local_480);
                          auVar129._0_4_ = auVar75._0_4_ * 3.0;
                          auVar129._4_4_ = auVar75._4_4_ * 3.0;
                          auVar129._8_4_ = auVar75._8_4_ * 3.0;
                          auVar129._12_4_ = auVar75._12_4_ * 3.0;
                          auVar145._4_4_ = fVar168;
                          auVar145._0_4_ = fVar168;
                          auVar145._8_4_ = fVar168;
                          auVar145._12_4_ = fVar168;
                          auVar75 = vfmadd132ps_fma(auVar145,auVar300,local_470);
                          auVar300 = vshufps_avx(auVar129,auVar129,0xc9);
                          auVar164._0_4_ = auVar75._0_4_ * auVar300._0_4_;
                          auVar164._4_4_ = auVar75._4_4_ * auVar300._4_4_;
                          auVar164._8_4_ = auVar75._8_4_ * auVar300._8_4_;
                          auVar164._12_4_ = auVar75._12_4_ * auVar300._12_4_;
                          auVar300 = vshufps_avx(auVar75,auVar75,0xc9);
                          auVar75 = vfmsub231ps_fma(auVar164,auVar129,auVar300);
                          auVar300 = vmovshdup_avx(auVar75);
                          local_180 = auVar300._0_8_;
                          uStack_178 = local_180;
                          uStack_170 = local_180;
                          uStack_168 = local_180;
                          auVar300 = vshufps_avx(auVar75,auVar75,0xaa);
                          local_160 = auVar300._0_8_;
                          uStack_158 = local_160;
                          uStack_150 = local_160;
                          uStack_148 = local_160;
                          local_140 = auVar75._0_4_;
                          uStack_13c = local_140;
                          uStack_138 = local_140;
                          uStack_134 = local_140;
                          uStack_130 = local_140;
                          uStack_12c = local_140;
                          uStack_128 = local_140;
                          uStack_124 = local_140;
                          fStack_11c = local_120;
                          fStack_118 = local_120;
                          fStack_114 = local_120;
                          fStack_110 = local_120;
                          fStack_10c = local_120;
                          fStack_108 = local_120;
                          fStack_104 = local_120;
                          local_100 = auVar9._0_8_;
                          uStack_f8 = local_100;
                          uStack_f0 = local_100;
                          uStack_e8 = local_100;
                          local_e0 = CONCAT44(uStack_33c,local_340);
                          uStack_d8 = CONCAT44(uStack_334,uStack_338);
                          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                          uStack_c8 = CONCAT44(uStack_324,uStack_328);
                          local_c0 = CONCAT44(uStack_31c,local_320);
                          uStack_b8 = CONCAT44(uStack_314,uStack_318);
                          uStack_b0 = CONCAT44(uStack_30c,uStack_310);
                          uStack_a8 = CONCAT44(uStack_304,uStack_308);
                          auVar82 = vpcmpeqd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar9));
                          uStack_9c = context->user->instID[0];
                          local_a0 = uStack_9c;
                          uStack_98 = uStack_9c;
                          uStack_94 = uStack_9c;
                          uStack_90 = uStack_9c;
                          uStack_8c = uStack_9c;
                          uStack_88 = uStack_9c;
                          uStack_84 = uStack_9c;
                          uStack_7c = context->user->instPrimID[0];
                          local_80 = uStack_7c;
                          uStack_78 = uStack_7c;
                          uStack_74 = uStack_7c;
                          uStack_70 = uStack_7c;
                          uStack_6c = uStack_7c;
                          uStack_68 = uStack_7c;
                          uStack_64 = uStack_7c;
                          *(float *)(ray + k * 4 + 0x100) = fVar103;
                          local_4c0 = local_360._0_8_;
                          uStack_4b8 = local_360._8_8_;
                          uStack_4b0 = local_360._16_8_;
                          uStack_4a8 = local_360._24_8_;
                          local_510.valid = (int *)&local_4c0;
                          local_510.geometryUserPtr = pGVar4->userPtr;
                          local_510.context = context->user;
                          local_510.ray = (RTCRayN *)ray;
                          local_510.hit = (RTCHitN *)&local_180;
                          local_510.N = 8;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->occlusionFilterN)(&local_510);
                            auVar311._8_56_ = extraout_var;
                            auVar311._0_8_ = extraout_XMM1_Qa;
                            auVar82 = vpcmpeqd_avx2(auVar311._0_32_,auVar311._0_32_);
                          }
                          auVar52._8_8_ = uStack_4b8;
                          auVar52._0_8_ = local_4c0;
                          auVar52._16_8_ = uStack_4b0;
                          auVar52._24_8_ = uStack_4a8;
                          auVar83 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar52
                                                 );
                          auVar84 = auVar82 & ~auVar83;
                          if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar84 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar84 >> 0x7f,0) == '\0') &&
                                (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar84 >> 0xbf,0) == '\0') &&
                              (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar84[0x1f]) {
                            auVar83 = auVar83 ^ auVar82;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&local_510);
                            }
                            auVar53._8_8_ = uStack_4b8;
                            auVar53._0_8_ = local_4c0;
                            auVar53._16_8_ = uStack_4b0;
                            auVar53._24_8_ = uStack_4a8;
                            auVar84 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                            auVar82 = vpcmpeqd_avx2(auVar84,auVar53);
                            auVar83 = vpcmpeqd_avx2(auVar84,auVar84);
                            auVar83 = auVar82 ^ auVar83;
                            auVar117._8_4_ = 0xff800000;
                            auVar117._0_8_ = 0xff800000ff800000;
                            auVar117._12_4_ = 0xff800000;
                            auVar117._16_4_ = 0xff800000;
                            auVar117._20_4_ = 0xff800000;
                            auVar117._24_4_ = 0xff800000;
                            auVar117._28_4_ = 0xff800000;
                            auVar82 = vblendvps_avx(auVar117,*(undefined1 (*) [32])
                                                              (local_510.ray + 0x100),auVar82);
                            *(undefined1 (*) [32])(local_510.ray + 0x100) = auVar82;
                          }
                          bVar48 = (auVar83 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar49 = (auVar83 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar47 = (auVar83 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar46 = SUB321(auVar83 >> 0x7f,0) != '\0';
                          bVar45 = (auVar83 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar44 = SUB321(auVar83 >> 0xbf,0) != '\0';
                          bVar43 = (auVar83 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar69 = auVar83[0x1f] < '\0';
                          if (((((((!bVar48 && !bVar49) && !bVar47) && !bVar46) && !bVar45) &&
                               !bVar44) && !bVar43) && !bVar69) {
                            *(float *)(ray + k * 4 + 0x100) = fVar133;
                          }
                          bVar69 = ((((((bVar48 || bVar49) || bVar47) || bVar46) || bVar45) ||
                                    bVar44) || bVar43) || bVar69;
                        }
                        auVar311 = ZEXT1664(local_770);
                        bVar68 = (bool)(bVar68 | bVar69);
                      }
                    }
                  }
                  goto LAB_016dd670;
                }
                break;
              }
              lVar63 = lVar63 + -1;
            } while (lVar63 != 0);
          }
          else {
            bVar42 = false;
          }
          goto LAB_016dd65e;
        }
      }
LAB_016dd670:
    } while (bVar42);
    local_450 = vinsertps_avx(auVar8,ZEXT416((uint)fVar166),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }